

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::sse2::CurveNiIntersectorK<4,4>::
     occluded_t<embree::sse2::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,4,4>,embree::sse2::Occluded1KEpilogMU<4,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  undefined1 (*pauVar2) [12];
  Primitive *pPVar3;
  undefined1 (*pauVar4) [16];
  Primitive PVar5;
  undefined4 uVar6;
  int iVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  undefined6 uVar14;
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  int iVar34;
  ulong uVar35;
  RTCFilterFunctionN p_Var36;
  RTCRayN *pRVar37;
  undefined1 *puVar38;
  byte bVar39;
  ulong uVar40;
  Geometry *pGVar41;
  bool bVar42;
  ulong uVar43;
  Geometry *geometry;
  long lVar44;
  ulong uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  short sVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  undefined2 uVar84;
  float fVar85;
  float fVar89;
  undefined1 auVar55 [16];
  undefined1 auVar58 [16];
  undefined1 auVar61 [16];
  float fVar86;
  float fVar90;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar68 [16];
  undefined1 auVar71 [16];
  undefined1 auVar74 [16];
  undefined1 auVar77 [16];
  float fVar87;
  float fVar88;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar95;
  float fVar110;
  float fVar111;
  vfloat4 v;
  undefined1 auVar96 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar112;
  float fVar119;
  float fVar120;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar121;
  float fVar127;
  float fVar128;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  float fVar129;
  float fVar141;
  float fVar142;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar143;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar144;
  float fVar145;
  float fVar158;
  float fVar160;
  undefined1 auVar146 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar159;
  float fVar161;
  float fVar162;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar163;
  float fVar164;
  float fVar169;
  float fVar171;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  float fVar170;
  float fVar172;
  float fVar173;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  float fVar174;
  float fVar175;
  float fVar191;
  float fVar194;
  undefined1 auVar176 [16];
  undefined1 auVar179 [16];
  undefined1 auVar182 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar189 [16];
  float fVar192;
  float fVar193;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  undefined1 auVar190 [16];
  float fVar199;
  float fVar204;
  float fVar205;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  float fVar206;
  float fVar208;
  float fVar209;
  undefined1 auVar207 [16];
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar224;
  float fVar226;
  undefined1 auVar218 [16];
  float fVar228;
  undefined1 auVar221 [16];
  float fVar225;
  float fVar227;
  float fVar229;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  float fVar230;
  float fVar238;
  float fVar239;
  float fVar240;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  float fVar241;
  float fVar247;
  float fVar248;
  float fVar249;
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  float fVar252;
  float fVar253;
  float fVar254;
  float fVar255;
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_4> bhit;
  uint local_4e8;
  undefined4 uStack_4e4;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  undefined8 local_478;
  undefined8 uStack_470;
  float local_468;
  float fStack_464;
  float fStack_460;
  undefined8 local_428;
  undefined8 uStack_420;
  float local_418;
  float fStack_414;
  float fStack_410;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  undefined1 local_3d8 [16];
  ulong local_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  RayQueryContext *local_338;
  undefined1 (*local_330) [16];
  RTCFilterFunctionNArguments local_328;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  undefined8 local_2e8;
  float fStack_2e0;
  float fStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [8];
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  float fStack_260;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  LinearSpace3fa *local_240;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b8 [16];
  uint local_1a8;
  int local_1a4;
  undefined8 local_198;
  undefined8 uStack_190;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined1 local_158 [16];
  float local_148 [4];
  undefined8 local_138;
  undefined8 uStack_130;
  undefined1 local_128 [16];
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  uint local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 uVar83;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  
  PVar5 = prim[1];
  uVar35 = (ulong)(byte)PVar5;
  pPVar3 = prim + uVar35 * 0x19 + 6;
  fVar120 = *(float *)(pPVar3 + 0xc);
  fVar121 = (*(float *)(ray + k * 4) - *(float *)pPVar3) * fVar120;
  fVar127 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar3 + 4)) * fVar120;
  fVar128 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar3 + 8)) * fVar120;
  fVar112 = *(float *)(ray + k * 4 + 0x40) * fVar120;
  fVar119 = *(float *)(ray + k * 4 + 0x50) * fVar120;
  fVar120 = *(float *)(ray + k * 4 + 0x60) * fVar120;
  uVar6 = *(undefined4 *)(prim + uVar35 * 4 + 6);
  uVar83 = (undefined1)((uint)uVar6 >> 0x18);
  uVar84 = CONCAT11(uVar83,uVar83);
  uVar83 = (undefined1)((uint)uVar6 >> 0x10);
  uVar12 = CONCAT35(CONCAT21(uVar84,uVar83),CONCAT14(uVar83,uVar6));
  uVar83 = (undefined1)((uint)uVar6 >> 8);
  uVar14 = CONCAT51(CONCAT41((int)((ulong)uVar12 >> 0x20),uVar83),uVar83);
  sVar50 = CONCAT11((char)uVar6,(char)uVar6);
  uVar45 = CONCAT62(uVar14,sVar50);
  auVar64._8_4_ = 0;
  auVar64._0_8_ = uVar45;
  auVar64._12_2_ = uVar84;
  auVar64._14_2_ = uVar84;
  uVar84 = (undefined2)((ulong)uVar12 >> 0x20);
  auVar152._12_4_ = auVar64._12_4_;
  auVar152._8_2_ = 0;
  auVar152._0_8_ = uVar45;
  auVar152._10_2_ = uVar84;
  auVar151._10_6_ = auVar152._10_6_;
  auVar151._8_2_ = uVar84;
  auVar151._0_8_ = uVar45;
  uVar84 = (undefined2)uVar14;
  auVar15._4_8_ = auVar151._8_8_;
  auVar15._2_2_ = uVar84;
  auVar15._0_2_ = uVar84;
  fVar95 = (float)((int)sVar50 >> 8);
  fVar110 = (float)(auVar15._0_4_ >> 0x18);
  fVar111 = (float)(auVar151._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar35 * 5 + 6);
  uVar83 = (undefined1)((uint)uVar6 >> 0x18);
  uVar84 = CONCAT11(uVar83,uVar83);
  uVar83 = (undefined1)((uint)uVar6 >> 0x10);
  uVar12 = CONCAT35(CONCAT21(uVar84,uVar83),CONCAT14(uVar83,uVar6));
  uVar83 = (undefined1)((uint)uVar6 >> 8);
  uVar14 = CONCAT51(CONCAT41((int)((ulong)uVar12 >> 0x20),uVar83),uVar83);
  sVar50 = CONCAT11((char)uVar6,(char)uVar6);
  uVar45 = CONCAT62(uVar14,sVar50);
  auVar57._8_4_ = 0;
  auVar57._0_8_ = uVar45;
  auVar57._12_2_ = uVar84;
  auVar57._14_2_ = uVar84;
  uVar84 = (undefined2)((ulong)uVar12 >> 0x20);
  auVar56._12_4_ = auVar57._12_4_;
  auVar56._8_2_ = 0;
  auVar56._0_8_ = uVar45;
  auVar56._10_2_ = uVar84;
  auVar55._10_6_ = auVar56._10_6_;
  auVar55._8_2_ = uVar84;
  auVar55._0_8_ = uVar45;
  uVar84 = (undefined2)uVar14;
  auVar16._4_8_ = auVar55._8_8_;
  auVar16._2_2_ = uVar84;
  auVar16._0_2_ = uVar84;
  fVar129 = (float)((int)sVar50 >> 8);
  fVar141 = (float)(auVar16._0_4_ >> 0x18);
  fVar142 = (float)(auVar55._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar35 * 6 + 6);
  uVar83 = (undefined1)((uint)uVar6 >> 0x18);
  uVar84 = CONCAT11(uVar83,uVar83);
  uVar83 = (undefined1)((uint)uVar6 >> 0x10);
  uVar12 = CONCAT35(CONCAT21(uVar84,uVar83),CONCAT14(uVar83,uVar6));
  uVar83 = (undefined1)((uint)uVar6 >> 8);
  uVar14 = CONCAT51(CONCAT41((int)((ulong)uVar12 >> 0x20),uVar83),uVar83);
  sVar50 = CONCAT11((char)uVar6,(char)uVar6);
  uVar45 = CONCAT62(uVar14,sVar50);
  auVar60._8_4_ = 0;
  auVar60._0_8_ = uVar45;
  auVar60._12_2_ = uVar84;
  auVar60._14_2_ = uVar84;
  uVar84 = (undefined2)((ulong)uVar12 >> 0x20);
  auVar59._12_4_ = auVar60._12_4_;
  auVar59._8_2_ = 0;
  auVar59._0_8_ = uVar45;
  auVar59._10_2_ = uVar84;
  auVar58._10_6_ = auVar59._10_6_;
  auVar58._8_2_ = uVar84;
  auVar58._0_8_ = uVar45;
  uVar84 = (undefined2)uVar14;
  auVar17._4_8_ = auVar58._8_8_;
  auVar17._2_2_ = uVar84;
  auVar17._0_2_ = uVar84;
  fVar163 = (float)((int)sVar50 >> 8);
  fVar169 = (float)(auVar17._0_4_ >> 0x18);
  fVar171 = (float)(auVar58._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar35 * 0xb + 6);
  uVar83 = (undefined1)((uint)uVar6 >> 0x18);
  uVar84 = CONCAT11(uVar83,uVar83);
  uVar83 = (undefined1)((uint)uVar6 >> 0x10);
  uVar12 = CONCAT35(CONCAT21(uVar84,uVar83),CONCAT14(uVar83,uVar6));
  uVar83 = (undefined1)((uint)uVar6 >> 8);
  uVar14 = CONCAT51(CONCAT41((int)((ulong)uVar12 >> 0x20),uVar83),uVar83);
  sVar50 = CONCAT11((char)uVar6,(char)uVar6);
  uVar45 = CONCAT62(uVar14,sVar50);
  auVar63._8_4_ = 0;
  auVar63._0_8_ = uVar45;
  auVar63._12_2_ = uVar84;
  auVar63._14_2_ = uVar84;
  uVar84 = (undefined2)((ulong)uVar12 >> 0x20);
  auVar62._12_4_ = auVar63._12_4_;
  auVar62._8_2_ = 0;
  auVar62._0_8_ = uVar45;
  auVar62._10_2_ = uVar84;
  auVar61._10_6_ = auVar62._10_6_;
  auVar61._8_2_ = uVar84;
  auVar61._0_8_ = uVar45;
  uVar84 = (undefined2)uVar14;
  auVar18._4_8_ = auVar61._8_8_;
  auVar18._2_2_ = uVar84;
  auVar18._0_2_ = uVar84;
  fVar51 = (float)((int)sVar50 >> 8);
  fVar85 = (float)(auVar18._0_4_ >> 0x18);
  fVar89 = (float)(auVar61._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + (ulong)((uint)(byte)PVar5 * 0xc) + 6);
  uVar83 = (undefined1)((uint)uVar6 >> 0x18);
  uVar84 = CONCAT11(uVar83,uVar83);
  uVar83 = (undefined1)((uint)uVar6 >> 0x10);
  uVar12 = CONCAT35(CONCAT21(uVar84,uVar83),CONCAT14(uVar83,uVar6));
  uVar83 = (undefined1)((uint)uVar6 >> 8);
  uVar14 = CONCAT51(CONCAT41((int)((ulong)uVar12 >> 0x20),uVar83),uVar83);
  sVar50 = CONCAT11((char)uVar6,(char)uVar6);
  uVar45 = CONCAT62(uVar14,sVar50);
  auVar148._8_4_ = 0;
  auVar148._0_8_ = uVar45;
  auVar148._12_2_ = uVar84;
  auVar148._14_2_ = uVar84;
  uVar84 = (undefined2)((ulong)uVar12 >> 0x20);
  auVar147._12_4_ = auVar148._12_4_;
  auVar147._8_2_ = 0;
  auVar147._0_8_ = uVar45;
  auVar147._10_2_ = uVar84;
  auVar146._10_6_ = auVar147._10_6_;
  auVar146._8_2_ = uVar84;
  auVar146._0_8_ = uVar45;
  uVar84 = (undefined2)uVar14;
  auVar19._4_8_ = auVar146._8_8_;
  auVar19._2_2_ = uVar84;
  auVar19._0_2_ = uVar84;
  fVar144 = (float)((int)sVar50 >> 8);
  fVar158 = (float)(auVar19._0_4_ >> 0x18);
  fVar160 = (float)(auVar146._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + (uint)(byte)PVar5 * 0xc + uVar35 + 6);
  uVar83 = (undefined1)((uint)uVar6 >> 0x18);
  uVar84 = CONCAT11(uVar83,uVar83);
  uVar83 = (undefined1)((uint)uVar6 >> 0x10);
  uVar12 = CONCAT35(CONCAT21(uVar84,uVar83),CONCAT14(uVar83,uVar6));
  uVar83 = (undefined1)((uint)uVar6 >> 8);
  uVar14 = CONCAT51(CONCAT41((int)((ulong)uVar12 >> 0x20),uVar83),uVar83);
  sVar50 = CONCAT11((char)uVar6,(char)uVar6);
  uVar45 = CONCAT62(uVar14,sVar50);
  auVar178._8_4_ = 0;
  auVar178._0_8_ = uVar45;
  auVar178._12_2_ = uVar84;
  auVar178._14_2_ = uVar84;
  uVar84 = (undefined2)((ulong)uVar12 >> 0x20);
  auVar177._12_4_ = auVar178._12_4_;
  auVar177._8_2_ = 0;
  auVar177._0_8_ = uVar45;
  auVar177._10_2_ = uVar84;
  auVar176._10_6_ = auVar177._10_6_;
  auVar176._8_2_ = uVar84;
  auVar176._0_8_ = uVar45;
  uVar84 = (undefined2)uVar14;
  auVar20._4_8_ = auVar176._8_8_;
  auVar20._2_2_ = uVar84;
  auVar20._0_2_ = uVar84;
  fVar206 = (float)((int)sVar50 >> 8);
  fVar208 = (float)(auVar20._0_4_ >> 0x18);
  fVar209 = (float)(auVar176._8_4_ >> 0x18);
  uVar43 = (ulong)(uint)((int)(uVar35 * 9) * 2);
  uVar6 = *(undefined4 *)(prim + uVar43 + 6);
  uVar83 = (undefined1)((uint)uVar6 >> 0x18);
  uVar84 = CONCAT11(uVar83,uVar83);
  uVar83 = (undefined1)((uint)uVar6 >> 0x10);
  uVar12 = CONCAT35(CONCAT21(uVar84,uVar83),CONCAT14(uVar83,uVar6));
  uVar83 = (undefined1)((uint)uVar6 >> 8);
  uVar14 = CONCAT51(CONCAT41((int)((ulong)uVar12 >> 0x20),uVar83),uVar83);
  sVar50 = CONCAT11((char)uVar6,(char)uVar6);
  uVar45 = CONCAT62(uVar14,sVar50);
  auVar181._8_4_ = 0;
  auVar181._0_8_ = uVar45;
  auVar181._12_2_ = uVar84;
  auVar181._14_2_ = uVar84;
  uVar84 = (undefined2)((ulong)uVar12 >> 0x20);
  auVar180._12_4_ = auVar181._12_4_;
  auVar180._8_2_ = 0;
  auVar180._0_8_ = uVar45;
  auVar180._10_2_ = uVar84;
  auVar179._10_6_ = auVar180._10_6_;
  auVar179._8_2_ = uVar84;
  auVar179._0_8_ = uVar45;
  uVar84 = (undefined2)uVar14;
  auVar21._4_8_ = auVar179._8_8_;
  auVar21._2_2_ = uVar84;
  auVar21._0_2_ = uVar84;
  fVar199 = (float)((int)sVar50 >> 8);
  fVar204 = (float)(auVar21._0_4_ >> 0x18);
  fVar205 = (float)(auVar179._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar43 + uVar35 + 6);
  uVar83 = (undefined1)((uint)uVar6 >> 0x18);
  uVar84 = CONCAT11(uVar83,uVar83);
  uVar83 = (undefined1)((uint)uVar6 >> 0x10);
  uVar12 = CONCAT35(CONCAT21(uVar84,uVar83),CONCAT14(uVar83,uVar6));
  uVar83 = (undefined1)((uint)uVar6 >> 8);
  uVar14 = CONCAT51(CONCAT41((int)((ulong)uVar12 >> 0x20),uVar83),uVar83);
  sVar50 = CONCAT11((char)uVar6,(char)uVar6);
  uVar45 = CONCAT62(uVar14,sVar50);
  auVar184._8_4_ = 0;
  auVar184._0_8_ = uVar45;
  auVar184._12_2_ = uVar84;
  auVar184._14_2_ = uVar84;
  uVar84 = (undefined2)((ulong)uVar12 >> 0x20);
  auVar183._12_4_ = auVar184._12_4_;
  auVar183._8_2_ = 0;
  auVar183._0_8_ = uVar45;
  auVar183._10_2_ = uVar84;
  auVar182._10_6_ = auVar183._10_6_;
  auVar182._8_2_ = uVar84;
  auVar182._0_8_ = uVar45;
  uVar84 = (undefined2)uVar14;
  auVar22._4_8_ = auVar182._8_8_;
  auVar22._2_2_ = uVar84;
  auVar22._0_2_ = uVar84;
  fVar210 = (float)((int)sVar50 >> 8);
  fVar212 = (float)(auVar22._0_4_ >> 0x18);
  fVar214 = (float)(auVar182._8_4_ >> 0x18);
  uVar40 = (ulong)(uint)((int)(uVar35 * 5) << 2);
  uVar6 = *(undefined4 *)(prim + uVar40 + 6);
  uVar83 = (undefined1)((uint)uVar6 >> 0x18);
  uVar84 = CONCAT11(uVar83,uVar83);
  uVar83 = (undefined1)((uint)uVar6 >> 0x10);
  uVar12 = CONCAT35(CONCAT21(uVar84,uVar83),CONCAT14(uVar83,uVar6));
  uVar83 = (undefined1)((uint)uVar6 >> 8);
  uVar14 = CONCAT51(CONCAT41((int)((ulong)uVar12 >> 0x20),uVar83),uVar83);
  sVar50 = CONCAT11((char)uVar6,(char)uVar6);
  uVar45 = CONCAT62(uVar14,sVar50);
  auVar220._8_4_ = 0;
  auVar220._0_8_ = uVar45;
  auVar220._12_2_ = uVar84;
  auVar220._14_2_ = uVar84;
  uVar84 = (undefined2)((ulong)uVar12 >> 0x20);
  auVar219._12_4_ = auVar220._12_4_;
  auVar219._8_2_ = 0;
  auVar219._0_8_ = uVar45;
  auVar219._10_2_ = uVar84;
  auVar218._10_6_ = auVar219._10_6_;
  auVar218._8_2_ = uVar84;
  auVar218._0_8_ = uVar45;
  uVar84 = (undefined2)uVar14;
  auVar23._4_8_ = auVar218._8_8_;
  auVar23._2_2_ = uVar84;
  auVar23._0_2_ = uVar84;
  fVar52 = (float)((int)sVar50 >> 8);
  fVar86 = (float)(auVar23._0_4_ >> 0x18);
  fVar90 = (float)(auVar218._8_4_ >> 0x18);
  fVar230 = fVar112 * fVar95 + fVar119 * fVar129 + fVar120 * fVar163;
  fVar238 = fVar112 * fVar110 + fVar119 * fVar141 + fVar120 * fVar169;
  fVar239 = fVar112 * fVar111 + fVar119 * fVar142 + fVar120 * fVar171;
  fVar240 = fVar112 * (float)(auVar152._12_4_ >> 0x18) +
            fVar119 * (float)(auVar56._12_4_ >> 0x18) + fVar120 * (float)(auVar59._12_4_ >> 0x18);
  fVar216 = fVar112 * fVar51 + fVar119 * fVar144 + fVar120 * fVar206;
  fVar224 = fVar112 * fVar85 + fVar119 * fVar158 + fVar120 * fVar208;
  fVar226 = fVar112 * fVar89 + fVar119 * fVar160 + fVar120 * fVar209;
  fVar228 = fVar112 * (float)(auVar62._12_4_ >> 0x18) +
            fVar119 * (float)(auVar147._12_4_ >> 0x18) + fVar120 * (float)(auVar177._12_4_ >> 0x18);
  fVar174 = fVar112 * fVar199 + fVar119 * fVar210 + fVar120 * fVar52;
  fVar191 = fVar112 * fVar204 + fVar119 * fVar212 + fVar120 * fVar86;
  fVar194 = fVar112 * fVar205 + fVar119 * fVar214 + fVar120 * fVar90;
  fVar112 = fVar112 * (float)(auVar180._12_4_ >> 0x18) +
            fVar119 * (float)(auVar183._12_4_ >> 0x18) + fVar120 * (float)(auVar219._12_4_ >> 0x18);
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x30);
  fVar129 = fVar95 * fVar121 + fVar129 * fVar127 + fVar163 * fVar128;
  fVar141 = fVar110 * fVar121 + fVar141 * fVar127 + fVar169 * fVar128;
  fVar142 = fVar111 * fVar121 + fVar142 * fVar127 + fVar171 * fVar128;
  fVar163 = (float)(auVar152._12_4_ >> 0x18) * fVar121 +
            (float)(auVar56._12_4_ >> 0x18) * fVar127 + (float)(auVar59._12_4_ >> 0x18) * fVar128;
  fVar169 = fVar51 * fVar121 + fVar144 * fVar127 + fVar206 * fVar128;
  fVar171 = fVar85 * fVar121 + fVar158 * fVar127 + fVar208 * fVar128;
  fVar206 = fVar89 * fVar121 + fVar160 * fVar127 + fVar209 * fVar128;
  fVar208 = (float)(auVar62._12_4_ >> 0x18) * fVar121 +
            (float)(auVar147._12_4_ >> 0x18) * fVar127 + (float)(auVar177._12_4_ >> 0x18) * fVar128;
  fVar144 = fVar121 * fVar199 + fVar127 * fVar210 + fVar128 * fVar52;
  fVar158 = fVar121 * fVar204 + fVar127 * fVar212 + fVar128 * fVar86;
  fVar160 = fVar121 * fVar205 + fVar127 * fVar214 + fVar128 * fVar90;
  fVar121 = fVar121 * (float)(auVar180._12_4_ >> 0x18) +
            fVar127 * (float)(auVar183._12_4_ >> 0x18) + fVar128 * (float)(auVar219._12_4_ >> 0x18);
  fVar120 = (float)DAT_01f80d30;
  fVar51 = DAT_01f80d30._4_4_;
  fVar52 = DAT_01f80d30._8_4_;
  fVar85 = DAT_01f80d30._12_4_;
  uVar46 = -(uint)(fVar120 <= ABS(fVar230));
  uVar47 = -(uint)(fVar51 <= ABS(fVar238));
  uVar48 = -(uint)(fVar52 <= ABS(fVar239));
  uVar49 = -(uint)(fVar85 <= ABS(fVar240));
  auVar231._0_4_ = (uint)fVar230 & uVar46;
  auVar231._4_4_ = (uint)fVar238 & uVar47;
  auVar231._8_4_ = (uint)fVar239 & uVar48;
  auVar231._12_4_ = (uint)fVar240 & uVar49;
  auVar130._0_4_ = ~uVar46 & (uint)fVar120;
  auVar130._4_4_ = ~uVar47 & (uint)fVar51;
  auVar130._8_4_ = ~uVar48 & (uint)fVar52;
  auVar130._12_4_ = ~uVar49 & (uint)fVar85;
  auVar130 = auVar130 | auVar231;
  uVar46 = -(uint)(fVar120 <= ABS(fVar216));
  uVar47 = -(uint)(fVar51 <= ABS(fVar224));
  uVar48 = -(uint)(fVar52 <= ABS(fVar226));
  uVar49 = -(uint)(fVar85 <= ABS(fVar228));
  auVar221._0_4_ = (uint)fVar216 & uVar46;
  auVar221._4_4_ = (uint)fVar224 & uVar47;
  auVar221._8_4_ = (uint)fVar226 & uVar48;
  auVar221._12_4_ = (uint)fVar228 & uVar49;
  auVar149._0_4_ = ~uVar46 & (uint)fVar120;
  auVar149._4_4_ = ~uVar47 & (uint)fVar51;
  auVar149._8_4_ = ~uVar48 & (uint)fVar52;
  auVar149._12_4_ = ~uVar49 & (uint)fVar85;
  auVar149 = auVar149 | auVar221;
  uVar46 = -(uint)(fVar120 <= ABS(fVar174));
  uVar47 = -(uint)(fVar51 <= ABS(fVar191));
  uVar48 = -(uint)(fVar52 <= ABS(fVar194));
  uVar49 = -(uint)(fVar85 <= ABS(fVar112));
  auVar185._0_4_ = (uint)fVar174 & uVar46;
  auVar185._4_4_ = (uint)fVar191 & uVar47;
  auVar185._8_4_ = (uint)fVar194 & uVar48;
  auVar185._12_4_ = (uint)fVar112 & uVar49;
  auVar165._0_4_ = ~uVar46 & (uint)fVar120;
  auVar165._4_4_ = ~uVar47 & (uint)fVar51;
  auVar165._8_4_ = ~uVar48 & (uint)fVar52;
  auVar165._12_4_ = ~uVar49 & (uint)fVar85;
  auVar165 = auVar165 | auVar185;
  auVar64 = rcpps(_DAT_01f80d30,auVar130);
  fVar120 = auVar64._0_4_;
  fVar85 = auVar64._4_4_;
  fVar90 = auVar64._8_4_;
  fVar111 = auVar64._12_4_;
  fVar120 = (1.0 - auVar130._0_4_ * fVar120) * fVar120 + fVar120;
  fVar85 = (1.0 - auVar130._4_4_ * fVar85) * fVar85 + fVar85;
  fVar90 = (1.0 - auVar130._8_4_ * fVar90) * fVar90 + fVar90;
  fVar111 = (1.0 - auVar130._12_4_ * fVar111) * fVar111 + fVar111;
  auVar64 = rcpps(auVar64,auVar149);
  fVar51 = auVar64._0_4_;
  fVar86 = auVar64._4_4_;
  fVar95 = auVar64._8_4_;
  fVar112 = auVar64._12_4_;
  fVar51 = (1.0 - auVar149._0_4_ * fVar51) * fVar51 + fVar51;
  fVar86 = (1.0 - auVar149._4_4_ * fVar86) * fVar86 + fVar86;
  fVar95 = (1.0 - auVar149._8_4_ * fVar95) * fVar95 + fVar95;
  fVar112 = (1.0 - auVar149._12_4_ * fVar112) * fVar112 + fVar112;
  auVar64 = rcpps(auVar64,auVar165);
  fVar52 = auVar64._0_4_;
  fVar89 = auVar64._4_4_;
  fVar110 = auVar64._8_4_;
  fVar119 = auVar64._12_4_;
  fVar52 = (1.0 - auVar165._0_4_ * fVar52) * fVar52 + fVar52;
  fVar89 = (1.0 - auVar165._4_4_ * fVar89) * fVar89 + fVar89;
  fVar110 = (1.0 - auVar165._8_4_ * fVar110) * fVar110 + fVar110;
  fVar119 = (1.0 - auVar165._12_4_ * fVar119) * fVar119 + fVar119;
  uVar45 = *(ulong *)(prim + uVar35 * 7 + 6);
  uVar84 = (undefined2)(uVar45 >> 0x30);
  auVar67._8_4_ = 0;
  auVar67._0_8_ = uVar45;
  auVar67._12_2_ = uVar84;
  auVar67._14_2_ = uVar84;
  uVar84 = (undefined2)(uVar45 >> 0x20);
  auVar66._12_4_ = auVar67._12_4_;
  auVar66._8_2_ = 0;
  auVar66._0_8_ = uVar45;
  auVar66._10_2_ = uVar84;
  auVar65._10_6_ = auVar66._10_6_;
  auVar65._8_2_ = uVar84;
  auVar65._0_8_ = uVar45;
  uVar84 = (undefined2)(uVar45 >> 0x10);
  auVar24._4_8_ = auVar65._8_8_;
  auVar24._2_2_ = uVar84;
  auVar24._0_2_ = uVar84;
  auVar131._0_8_ =
       CONCAT44(((float)(auVar24._0_4_ >> 0x10) - fVar141) * fVar85,
                ((float)(int)(short)uVar45 - fVar129) * fVar120);
  auVar131._8_4_ = ((float)(auVar65._8_4_ >> 0x10) - fVar142) * fVar90;
  auVar131._12_4_ = ((float)(auVar66._12_4_ >> 0x10) - fVar163) * fVar111;
  uVar45 = *(ulong *)(prim + uVar35 * 9 + 6);
  uVar84 = (undefined2)(uVar45 >> 0x30);
  auVar70._8_4_ = 0;
  auVar70._0_8_ = uVar45;
  auVar70._12_2_ = uVar84;
  auVar70._14_2_ = uVar84;
  uVar84 = (undefined2)(uVar45 >> 0x20);
  auVar69._12_4_ = auVar70._12_4_;
  auVar69._8_2_ = 0;
  auVar69._0_8_ = uVar45;
  auVar69._10_2_ = uVar84;
  auVar68._10_6_ = auVar69._10_6_;
  auVar68._8_2_ = uVar84;
  auVar68._0_8_ = uVar45;
  uVar84 = (undefined2)(uVar45 >> 0x10);
  auVar25._4_8_ = auVar68._8_8_;
  auVar25._2_2_ = uVar84;
  auVar25._0_2_ = uVar84;
  auVar166._0_4_ = ((float)(int)(short)uVar45 - fVar129) * fVar120;
  auVar166._4_4_ = ((float)(auVar25._0_4_ >> 0x10) - fVar141) * fVar85;
  auVar166._8_4_ = ((float)(auVar68._8_4_ >> 0x10) - fVar142) * fVar90;
  auVar166._12_4_ = ((float)(auVar69._12_4_ >> 0x10) - fVar163) * fVar111;
  uVar45 = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + 6);
  uVar43 = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + uVar35 * -2 + 6);
  uVar84 = (undefined2)(uVar43 >> 0x30);
  auVar98._8_4_ = 0;
  auVar98._0_8_ = uVar43;
  auVar98._12_2_ = uVar84;
  auVar98._14_2_ = uVar84;
  uVar84 = (undefined2)(uVar43 >> 0x20);
  auVar97._12_4_ = auVar98._12_4_;
  auVar97._8_2_ = 0;
  auVar97._0_8_ = uVar43;
  auVar97._10_2_ = uVar84;
  auVar96._10_6_ = auVar97._10_6_;
  auVar96._8_2_ = uVar84;
  auVar96._0_8_ = uVar43;
  uVar84 = (undefined2)(uVar43 >> 0x10);
  auVar26._4_8_ = auVar96._8_8_;
  auVar26._2_2_ = uVar84;
  auVar26._0_2_ = uVar84;
  auVar99._0_8_ =
       CONCAT44(((float)(auVar26._0_4_ >> 0x10) - fVar171) * fVar86,
                ((float)(int)(short)uVar43 - fVar169) * fVar51);
  auVar99._8_4_ = ((float)(auVar96._8_4_ >> 0x10) - fVar206) * fVar95;
  auVar99._12_4_ = ((float)(auVar97._12_4_ >> 0x10) - fVar208) * fVar112;
  uVar84 = (undefined2)(uVar45 >> 0x30);
  auVar73._8_4_ = 0;
  auVar73._0_8_ = uVar45;
  auVar73._12_2_ = uVar84;
  auVar73._14_2_ = uVar84;
  uVar84 = (undefined2)(uVar45 >> 0x20);
  auVar72._12_4_ = auVar73._12_4_;
  auVar72._8_2_ = 0;
  auVar72._0_8_ = uVar45;
  auVar72._10_2_ = uVar84;
  auVar71._10_6_ = auVar72._10_6_;
  auVar71._8_2_ = uVar84;
  auVar71._0_8_ = uVar45;
  uVar84 = (undefined2)(uVar45 >> 0x10);
  auVar27._4_8_ = auVar71._8_8_;
  auVar27._2_2_ = uVar84;
  auVar27._0_2_ = uVar84;
  auVar203._0_4_ = ((float)(int)(short)uVar45 - fVar169) * fVar51;
  auVar203._4_4_ = ((float)(auVar27._0_4_ >> 0x10) - fVar171) * fVar86;
  auVar203._8_4_ = ((float)(auVar71._8_4_ >> 0x10) - fVar206) * fVar95;
  auVar203._12_4_ = ((float)(auVar72._12_4_ >> 0x10) - fVar208) * fVar112;
  uVar45 = *(ulong *)(prim + uVar40 + uVar35 + 6);
  uVar84 = (undefined2)(uVar45 >> 0x30);
  auVar76._8_4_ = 0;
  auVar76._0_8_ = uVar45;
  auVar76._12_2_ = uVar84;
  auVar76._14_2_ = uVar84;
  uVar84 = (undefined2)(uVar45 >> 0x20);
  auVar75._12_4_ = auVar76._12_4_;
  auVar75._8_2_ = 0;
  auVar75._0_8_ = uVar45;
  auVar75._10_2_ = uVar84;
  auVar74._10_6_ = auVar75._10_6_;
  auVar74._8_2_ = uVar84;
  auVar74._0_8_ = uVar45;
  uVar84 = (undefined2)(uVar45 >> 0x10);
  auVar28._4_8_ = auVar74._8_8_;
  auVar28._2_2_ = uVar84;
  auVar28._0_2_ = uVar84;
  auVar77._0_8_ =
       CONCAT44(((float)(auVar28._0_4_ >> 0x10) - fVar158) * fVar89,
                ((float)(int)(short)uVar45 - fVar144) * fVar52);
  auVar77._8_4_ = ((float)(auVar74._8_4_ >> 0x10) - fVar160) * fVar110;
  auVar77._12_4_ = ((float)(auVar75._12_4_ >> 0x10) - fVar121) * fVar119;
  uVar45 = *(ulong *)(prim + uVar35 * 0x17 + 6);
  uVar84 = (undefined2)(uVar45 >> 0x30);
  auVar188._8_4_ = 0;
  auVar188._0_8_ = uVar45;
  auVar188._12_2_ = uVar84;
  auVar188._14_2_ = uVar84;
  uVar84 = (undefined2)(uVar45 >> 0x20);
  auVar187._12_4_ = auVar188._12_4_;
  auVar187._8_2_ = 0;
  auVar187._0_8_ = uVar45;
  auVar187._10_2_ = uVar84;
  auVar186._10_6_ = auVar187._10_6_;
  auVar186._8_2_ = uVar84;
  auVar186._0_8_ = uVar45;
  uVar84 = (undefined2)(uVar45 >> 0x10);
  auVar29._4_8_ = auVar186._8_8_;
  auVar29._2_2_ = uVar84;
  auVar29._0_2_ = uVar84;
  auVar189._0_4_ = ((float)(int)(short)uVar45 - fVar144) * fVar52;
  auVar189._4_4_ = ((float)(auVar29._0_4_ >> 0x10) - fVar158) * fVar89;
  auVar189._8_4_ = ((float)(auVar186._8_4_ >> 0x10) - fVar160) * fVar110;
  auVar189._12_4_ = ((float)(auVar187._12_4_ >> 0x10) - fVar121) * fVar119;
  auVar150._8_4_ = auVar131._8_4_;
  auVar150._0_8_ = auVar131._0_8_;
  auVar150._12_4_ = auVar131._12_4_;
  auVar151 = minps(auVar150,auVar166);
  auVar113._8_4_ = auVar99._8_4_;
  auVar113._0_8_ = auVar99._0_8_;
  auVar113._12_4_ = auVar99._12_4_;
  auVar64 = minps(auVar113,auVar203);
  auVar151 = maxps(auVar151,auVar64);
  auVar114._8_4_ = auVar77._8_4_;
  auVar114._0_8_ = auVar77._0_8_;
  auVar114._12_4_ = auVar77._12_4_;
  auVar64 = minps(auVar114,auVar189);
  auVar122._4_4_ = uVar6;
  auVar122._0_4_ = uVar6;
  auVar122._8_4_ = uVar6;
  auVar122._12_4_ = uVar6;
  auVar64 = maxps(auVar64,auVar122);
  auVar152 = maxps(auVar151,auVar64);
  auVar151 = maxps(auVar131,auVar166);
  auVar64 = maxps(auVar99,auVar203);
  auVar151 = minps(auVar151,auVar64);
  local_48 = auVar152._0_4_ * 0.99999964;
  fStack_44 = auVar152._4_4_ * 0.99999964;
  fStack_40 = auVar152._8_4_ * 0.99999964;
  fStack_3c = auVar152._12_4_ * 0.99999964;
  auVar64 = maxps(auVar77,auVar189);
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar100._4_4_ = uVar6;
  auVar100._0_4_ = uVar6;
  auVar100._8_4_ = uVar6;
  auVar100._12_4_ = uVar6;
  auVar64 = minps(auVar64,auVar100);
  auVar64 = minps(auVar151,auVar64);
  auVar101._0_4_ = -(uint)(PVar5 != (Primitive)0x0 && local_48 <= auVar64._0_4_ * 1.0000004);
  auVar101._4_4_ = -(uint)(1 < (byte)PVar5 && fStack_44 <= auVar64._4_4_ * 1.0000004);
  auVar101._8_4_ = -(uint)(2 < (byte)PVar5 && fStack_40 <= auVar64._8_4_ * 1.0000004);
  auVar101._12_4_ = -(uint)(3 < (byte)PVar5 && fStack_3c <= auVar64._12_4_ * 1.0000004);
  uVar46 = movmskps((uint)(byte)PVar5,auVar101);
  if (uVar46 == 0) {
    bVar42 = false;
  }
  else {
    uVar46 = uVar46 & 0xff;
    local_240 = pre->ray_space + k;
    local_3b8 = mm_lookupmask_ps._0_8_;
    uStack_3b0 = mm_lookupmask_ps._8_8_;
    local_330 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
    do {
      uVar45 = (ulong)uVar46;
      lVar10 = 0;
      if (uVar45 != 0) {
        for (; (uVar46 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
        }
      }
      uVar45 = uVar45 - 1 & uVar45;
      uStack_420._0_4_ = *(uint *)(prim + 2);
      local_3c0 = (ulong)(uint)uStack_420;
      uStack_470._0_4_ = *(uint *)(prim + lVar10 * 4 + 6);
      local_2e8 = (ulong)(uint)uStack_470;
      pGVar8 = (context->scene->geometries).items[local_3c0].ptr;
      _Var9 = pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      uVar43 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 + _Var9 * local_2e8);
      pGVar41 = (Geometry *)pGVar8[1].intersectionFilterN;
      lVar10 = *(long *)&pGVar8[1].time_range.upper;
      pfVar1 = (float *)(lVar10 + (long)pGVar41 * uVar43);
      local_2b8 = *pfVar1;
      fStack_2b4 = pfVar1[1];
      local_198 = *(undefined8 *)pfVar1;
      fStack_2b0 = pfVar1[2];
      fStack_2ac = pfVar1[3];
      uStack_190 = *(undefined8 *)(pfVar1 + 2);
      pfVar1 = (float *)(lVar10 + (uVar43 + 1) * (long)pGVar41);
      fVar120 = *pfVar1;
      fVar51 = pfVar1[1];
      fVar52 = pfVar1[2];
      fVar85 = pfVar1[3];
      pfVar1 = (float *)(lVar10 + (uVar43 + 2) * (long)pGVar41);
      local_2c8 = *pfVar1;
      fStack_2c4 = pfVar1[1];
      local_178 = *(undefined8 *)pfVar1;
      fStack_2c0 = pfVar1[2];
      fStack_2bc = pfVar1[3];
      uStack_170 = *(undefined8 *)(pfVar1 + 2);
      lVar44 = 0;
      if (uVar45 != 0) {
        for (; (uVar45 >> lVar44 & 1) == 0; lVar44 = lVar44 + 1) {
        }
      }
      pfVar1 = (float *)(lVar10 + (uVar43 + 3) * (long)pGVar41);
      local_2d8 = *pfVar1;
      fStack_2d4 = pfVar1[1];
      local_168 = *(undefined8 *)pfVar1;
      fStack_2d0 = pfVar1[2];
      fStack_2cc = pfVar1[3];
      uStack_160 = *(undefined8 *)(pfVar1 + 2);
      if ((uVar45 != 0) && (uVar43 = uVar45 - 1 & uVar45, uVar43 != 0)) {
        lVar10 = 0;
        if (uVar43 != 0) {
          for (; (uVar43 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
          }
        }
        pGVar41 = (Geometry *)
                  ((long)pGVar41 *
                  (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                                  _Var9 * *(uint *)(prim + lVar10 * 4 + 6)));
      }
      iVar7 = (int)pGVar8[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      fVar86 = *(float *)(ray + k * 4);
      fVar89 = *(float *)(ray + k * 4 + 0x10);
      fVar90 = *(float *)(ray + k * 4 + 0x20);
      fVar144 = local_2b8 - fVar86;
      fVar158 = fStack_2b4 - fVar89;
      fVar160 = fStack_2b0 - fVar90;
      fVar95 = (local_240->vx).field_0.m128[0];
      fVar110 = (local_240->vx).field_0.m128[1];
      fVar111 = (local_240->vx).field_0.m128[2];
      fVar112 = (local_240->vy).field_0.m128[0];
      fVar119 = (local_240->vy).field_0.m128[1];
      fVar129 = (local_240->vy).field_0.m128[2];
      fVar141 = (local_240->vz).field_0.m128[0];
      fVar142 = (local_240->vz).field_0.m128[1];
      fVar163 = (local_240->vz).field_0.m128[2];
      local_1e8 = fVar144 * fVar95 + fVar158 * fVar112 + fVar160 * fVar141;
      local_1f8 = fVar144 * fVar110 + fVar158 * fVar119 + fVar160 * fVar142;
      fVar121 = fVar144 * fVar111 + fVar158 * fVar129 + fVar160 * fVar163;
      fVar144 = fVar120 - fVar86;
      fVar158 = fVar51 - fVar89;
      fVar160 = fVar52 - fVar90;
      local_368 = fVar144 * fVar95 + fVar158 * fVar112 + fVar160 * fVar141;
      local_298 = fVar144 * fVar110 + fVar158 * fVar119 + fVar160 * fVar142;
      local_398 = fVar144 * fVar111 + fVar158 * fVar129 + fVar160 * fVar163;
      fVar144 = local_2c8 - fVar86;
      fVar158 = fStack_2c4 - fVar89;
      fVar160 = fStack_2c0 - fVar90;
      fVar127 = fVar144 * fVar95 + fVar158 * fVar112 + fVar160 * fVar141;
      fVar128 = fVar144 * fVar110 + fVar158 * fVar119 + fVar160 * fVar142;
      local_348 = fVar144 * fVar111 + fVar158 * fVar129 + fVar160 * fVar163;
      fVar86 = local_2d8 - fVar86;
      fVar89 = fStack_2d4 - fVar89;
      fVar90 = fStack_2d0 - fVar90;
      fVar95 = fVar86 * fVar95 + fVar89 * fVar112 + fVar90 * fVar141;
      fVar110 = fVar86 * fVar110 + fVar89 * fVar119 + fVar90 * fVar142;
      local_358 = fVar86 * fVar111 + fVar89 * fVar129 + fVar90 * fVar163;
      auVar232._0_8_ = CONCAT44(local_1f8,local_1e8) & 0x7fffffff7fffffff;
      auVar232._8_4_ = ABS(fVar121);
      auVar232._12_4_ = ABS(fStack_2ac);
      auVar132._0_8_ = CONCAT44(local_298,local_368) & 0x7fffffff7fffffff;
      auVar132._8_4_ = ABS(local_398);
      auVar132._12_4_ = ABS(fVar85);
      auVar151 = maxps(auVar232,auVar132);
      auVar153._0_8_ = CONCAT44(fVar128,fVar127) & 0x7fffffff7fffffff;
      auVar153._8_4_ = ABS(local_348);
      auVar153._12_4_ = ABS(fStack_2bc);
      auVar102._0_8_ = CONCAT44(fVar110,fVar95) & 0x7fffffff7fffffff;
      auVar102._8_4_ = ABS(local_358);
      auVar102._12_4_ = ABS(fStack_2cc);
      auVar64 = maxps(auVar153,auVar102);
      auVar64 = maxps(auVar151,auVar64);
      fVar86 = auVar64._4_4_;
      if (auVar64._4_4_ <= auVar64._0_4_) {
        fVar86 = auVar64._0_4_;
      }
      auVar233._8_8_ = auVar64._8_8_;
      auVar233._0_8_ = auVar64._8_8_;
      fVar89 = (float)iVar7;
      _local_2f8 = ZEXT416((uint)fVar89);
      if (auVar64._8_4_ <= fVar86) {
        auVar233._0_4_ = fVar86;
      }
      lVar10 = (long)iVar7 * 0x44;
      fVar86 = *(float *)*(undefined1 (*) [12])(catmullrom_basis0 + lVar10 + 0x908);
      fVar90 = *(float *)(catmullrom_basis0 + lVar10 + 0x90c);
      fVar111 = *(float *)(catmullrom_basis0 + lVar10 + 0x910);
      auVar15 = *(undefined1 (*) [12])(catmullrom_basis0 + lVar10 + 0x908);
      fVar112 = *(float *)(catmullrom_basis0 + lVar10 + 0x914);
      fVar119 = *(float *)(catmullrom_basis0 + lVar10 + 0xd8c);
      fVar129 = *(float *)(catmullrom_basis0 + lVar10 + 0xd90);
      fVar141 = *(float *)(catmullrom_basis0 + lVar10 + 0xd94);
      fVar142 = *(float *)(catmullrom_basis0 + lVar10 + 0xd98);
      fVar163 = *(float *)*(undefined1 (*) [12])(catmullrom_basis0 + lVar10 + 0x484);
      fVar144 = *(float *)(catmullrom_basis0 + lVar10 + 0x488);
      fVar158 = *(float *)(catmullrom_basis0 + lVar10 + 0x48c);
      auVar16 = *(undefined1 (*) [12])(catmullrom_basis0 + lVar10 + 0x484);
      fVar160 = *(float *)(catmullrom_basis0 + lVar10 + 0x490);
      fVar169 = *(float *)(catmullrom_basis0 + lVar10);
      fVar171 = *(float *)(catmullrom_basis0 + lVar10 + 4);
      fVar174 = *(float *)(catmullrom_basis0 + lVar10 + 8);
      fVar191 = *(float *)(catmullrom_basis0 + lVar10 + 0xc);
      local_378 = local_1e8 * fVar169 + local_368 * fVar163 + fVar127 * fVar86 + fVar95 * fVar119;
      fStack_374 = local_1e8 * fVar171 + local_368 * fVar144 + fVar127 * fVar90 + fVar95 * fVar129;
      fStack_370 = local_1e8 * fVar174 + local_368 * fVar158 + fVar127 * fVar111 + fVar95 * fVar141;
      fStack_36c = local_1e8 * fVar191 + local_368 * fVar160 + fVar127 * fVar112 + fVar95 * fVar142;
      local_258 = local_1f8 * fVar169 + local_298 * fVar163 + fVar128 * fVar86 + fVar110 * fVar119;
      fStack_254 = local_1f8 * fVar171 + local_298 * fVar144 + fVar128 * fVar90 + fVar110 * fVar129;
      fStack_250 = local_1f8 * fVar174 + local_298 * fVar158 + fVar128 * fVar111 + fVar110 * fVar141
      ;
      fStack_24c = local_1f8 * fVar191 + local_298 * fVar160 + fVar128 * fVar112 + fVar110 * fVar142
      ;
      fVar216 = fStack_2ac * fVar169 + fVar85 * fVar163 + fStack_2bc * fVar86 + fStack_2cc * fVar119
      ;
      fVar224 = fStack_2ac * fVar171 + fVar85 * fVar144 + fStack_2bc * fVar90 + fStack_2cc * fVar129
      ;
      auVar200._4_4_ = fVar224;
      auVar200._0_4_ = fVar216;
      fVar226 = fStack_2ac * fVar174 +
                fVar85 * fVar158 + fStack_2bc * fVar111 + fStack_2cc * fVar141;
      fVar228 = fStack_2ac * fVar191 +
                fVar85 * fVar160 + fStack_2bc * fVar112 + fStack_2cc * fVar142;
      fVar90 = *(float *)(catmullrom_basis1 + lVar10 + 0xd8c);
      fVar111 = *(float *)(catmullrom_basis1 + lVar10 + 0xd90);
      fVar163 = *(float *)(catmullrom_basis1 + lVar10 + 0xd94);
      fVar144 = *(float *)(catmullrom_basis1 + lVar10 + 0xd98);
      fVar86 = *(float *)*(undefined1 (*) [12])(catmullrom_basis1 + lVar10 + 0x908);
      fVar158 = *(float *)(catmullrom_basis1 + lVar10 + 0x90c);
      fVar194 = *(float *)(catmullrom_basis1 + lVar10 + 0x910);
      auVar17 = *(undefined1 (*) [12])(catmullrom_basis1 + lVar10 + 0x908);
      fVar199 = *(float *)(catmullrom_basis1 + lVar10 + 0x914);
      fVar204 = *(float *)(catmullrom_basis1 + lVar10 + 0x484);
      fVar205 = *(float *)(catmullrom_basis1 + lVar10 + 0x488);
      fVar206 = *(float *)(catmullrom_basis1 + lVar10 + 0x48c);
      fVar208 = *(float *)(catmullrom_basis1 + lVar10 + 0x490);
      fVar209 = *(float *)(catmullrom_basis1 + lVar10);
      fVar210 = *(float *)(catmullrom_basis1 + lVar10 + 4);
      fVar212 = *(float *)(catmullrom_basis1 + lVar10 + 8);
      fVar214 = *(float *)(catmullrom_basis1 + lVar10 + 0xc);
      fVar164 = local_1e8 * fVar209 + local_368 * fVar204 + fVar127 * fVar86 + fVar95 * fVar90;
      fVar170 = local_1e8 * fVar210 + local_368 * fVar205 + fVar127 * fVar158 + fVar95 * fVar111;
      fVar172 = local_1e8 * fVar212 + local_368 * fVar206 + fVar127 * fVar194 + fVar95 * fVar163;
      fVar173 = local_1e8 * fVar214 + local_368 * fVar208 + fVar127 * fVar199 + fVar95 * fVar144;
      fVar241 = local_1f8 * fVar209 + local_298 * fVar204 + fVar128 * fVar86 + fVar110 * fVar90;
      fVar247 = local_1f8 * fVar210 + local_298 * fVar205 + fVar128 * fVar158 + fVar110 * fVar111;
      fVar248 = local_1f8 * fVar212 + local_298 * fVar206 + fVar128 * fVar194 + fVar110 * fVar163;
      fVar249 = local_1f8 * fVar214 + local_298 * fVar208 + fVar128 * fVar199 + fVar110 * fVar144;
      auVar115._0_4_ =
           fStack_2ac * fVar209 + fVar85 * fVar204 + fStack_2bc * fVar86 + fStack_2cc * fVar90;
      auVar115._4_4_ =
           fStack_2ac * fVar210 + fVar85 * fVar205 + fStack_2bc * fVar158 + fStack_2cc * fVar111;
      auVar115._8_4_ =
           fStack_2ac * fVar212 + fVar85 * fVar206 + fStack_2bc * fVar194 + fStack_2cc * fVar163;
      auVar115._12_4_ =
           fStack_2ac * fVar214 + fVar85 * fVar208 + fStack_2bc * fVar199 + fStack_2cc * fVar144;
      local_388 = fVar164 - local_378;
      fStack_384 = fVar170 - fStack_374;
      fStack_380 = fVar172 - fStack_370;
      fStack_37c = fVar173 - fStack_36c;
      fVar238 = fVar241 - local_258;
      fVar239 = fVar247 - fStack_254;
      fVar240 = fVar248 - fStack_250;
      fVar143 = fVar249 - fStack_24c;
      fVar86 = local_258 * local_388 - local_378 * fVar238;
      fVar158 = fStack_254 * fStack_384 - fStack_374 * fVar239;
      fVar194 = fStack_250 * fStack_380 - fStack_370 * fVar240;
      fVar230 = fStack_24c * fStack_37c - fStack_36c * fVar143;
      auVar200._8_4_ = fVar226;
      auVar200._12_4_ = fVar228;
      auVar64 = maxps(auVar200,auVar115);
      bVar31 = fVar86 * fVar86 <=
               auVar64._0_4_ * auVar64._0_4_ * (local_388 * local_388 + fVar238 * fVar238) &&
               0.0 < fVar89;
      local_268._0_4_ = -(uint)bVar31;
      bVar32 = fVar158 * fVar158 <=
               auVar64._4_4_ * auVar64._4_4_ * (fStack_384 * fStack_384 + fVar239 * fVar239) &&
               1.0 < fVar89;
      local_268._4_4_ = -(uint)bVar32;
      bVar30 = fVar194 * fVar194 <=
               auVar64._8_4_ * auVar64._8_4_ * (fStack_380 * fStack_380 + fVar240 * fVar240) &&
               2.0 < fVar89;
      fStack_260 = (float)-(uint)bVar30;
      bVar42 = fVar230 * fVar230 <=
               auVar64._12_4_ * auVar64._12_4_ * (fStack_37c * fStack_37c + fVar143 * fVar143) &&
               3.0 < fVar89;
      register0x000012cc = -(uint)bVar42;
      local_3a8 = auVar233._0_4_;
      fStack_3a4 = auVar233._4_4_;
      fStack_3a0 = auVar233._8_4_;
      fStack_39c = auVar233._12_4_;
      local_3a8 = local_3a8 * 4.7683716e-07;
      iVar34 = movmskps(iVar7,_local_268);
      fVar86 = *(float *)(ray + k * 4 + 0x30);
      _local_2a8 = ZEXT416((uint)fVar86);
      fStack_394 = local_398;
      fStack_390 = local_398;
      fStack_38c = local_398;
      fStack_364 = local_368;
      fStack_360 = local_368;
      fStack_35c = local_368;
      fStack_354 = local_358;
      fStack_350 = local_358;
      fStack_34c = local_358;
      fStack_344 = local_348;
      fStack_340 = local_348;
      fStack_33c = local_348;
      fStack_294 = local_298;
      fStack_290 = local_298;
      fStack_28c = local_298;
      local_238 = fStack_2ac;
      fStack_234 = fStack_2ac;
      fStack_230 = fStack_2ac;
      fStack_22c = fStack_2ac;
      local_228 = fVar85;
      fStack_224 = fVar85;
      fStack_220 = fVar85;
      fStack_21c = fVar85;
      local_218 = fStack_2cc;
      fStack_214 = fStack_2cc;
      fStack_210 = fStack_2cc;
      fStack_20c = fStack_2cc;
      local_208 = fStack_2bc;
      fStack_204 = fStack_2bc;
      fStack_200 = fStack_2bc;
      fStack_1fc = fStack_2bc;
      fStack_1f4 = local_1f8;
      fStack_1f0 = local_1f8;
      fStack_1ec = local_1f8;
      fStack_1e4 = local_1e8;
      fStack_1e0 = local_1e8;
      fStack_1dc = local_1e8;
      if (iVar34 == 0) {
        bVar42 = false;
        local_4e8 = 0;
      }
      else {
        local_468 = auVar17._0_4_;
        fStack_464 = auVar17._4_4_;
        fStack_460 = auVar17._8_4_;
        fVar53 = fVar90 * local_358 + local_468 * local_348 + fVar204 * local_398 +
                 fVar209 * fVar121;
        fVar87 = fVar111 * local_358 + fStack_464 * local_348 + fVar205 * local_398 +
                 fVar210 * fVar121;
        fVar91 = fVar163 * local_358 + fStack_460 * local_348 + fVar206 * local_398 +
                 fVar212 * fVar121;
        fVar93 = fVar144 * local_358 + fVar199 * local_348 + fVar208 * local_398 + fVar214 * fVar121
        ;
        local_418 = auVar16._0_4_;
        fStack_414 = auVar16._4_4_;
        fStack_410 = auVar16._8_4_;
        local_3e8 = auVar15._0_4_;
        fStack_3e4 = auVar15._4_4_;
        fStack_3e0 = auVar15._8_4_;
        fVar54 = fVar119 * local_358 + local_3e8 * local_348 + local_418 * local_398 +
                 fVar169 * fVar121;
        fVar88 = fVar129 * local_358 + fStack_3e4 * local_348 + fStack_414 * local_398 +
                 fVar171 * fVar121;
        fVar92 = fVar141 * local_358 + fStack_3e0 * local_348 + fStack_410 * local_398 +
                 fVar174 * fVar121;
        fVar94 = fVar142 * local_358 + fVar112 * local_348 + fVar160 * local_398 + fVar191 * fVar121
        ;
        fVar90 = *(float *)(catmullrom_basis0 + lVar10 + 0x1210);
        fVar111 = *(float *)(catmullrom_basis0 + lVar10 + 0x1214);
        fVar112 = *(float *)(catmullrom_basis0 + lVar10 + 0x1218);
        fVar119 = *(float *)(catmullrom_basis0 + lVar10 + 0x121c);
        fVar129 = *(float *)(catmullrom_basis0 + lVar10 + 0x1694);
        fVar141 = *(float *)(catmullrom_basis0 + lVar10 + 0x1698);
        fVar142 = *(float *)(catmullrom_basis0 + lVar10 + 0x169c);
        fVar163 = *(float *)(catmullrom_basis0 + lVar10 + 0x16a0);
        fVar144 = *(float *)(catmullrom_basis0 + lVar10 + 0x1b18);
        fVar158 = *(float *)(catmullrom_basis0 + lVar10 + 0x1b1c);
        fVar160 = *(float *)(catmullrom_basis0 + lVar10 + 0x1b20);
        fVar169 = *(float *)(catmullrom_basis0 + lVar10 + 0x1b24);
        fVar171 = *(float *)(catmullrom_basis0 + lVar10 + 0x1f9c);
        fVar174 = *(float *)(catmullrom_basis0 + lVar10 + 0x1fa0);
        fVar191 = *(float *)(catmullrom_basis0 + lVar10 + 0x1fa4);
        fVar194 = *(float *)(catmullrom_basis0 + lVar10 + 0x1fa8);
        fVar217 = local_1e8 * fVar90 + local_368 * fVar129 + fVar127 * fVar144 + fVar95 * fVar171;
        fVar225 = local_1e8 * fVar111 + local_368 * fVar141 + fVar127 * fVar158 + fVar95 * fVar174;
        fVar227 = local_1e8 * fVar112 + local_368 * fVar142 + fVar127 * fVar160 + fVar95 * fVar191;
        fVar229 = local_1e8 * fVar119 + local_368 * fVar163 + fVar127 * fVar169 + fVar95 * fVar194;
        fVar252 = local_1f8 * fVar90 + local_298 * fVar129 + fVar128 * fVar144 + fVar110 * fVar171;
        fVar253 = local_1f8 * fVar111 + local_298 * fVar141 + fVar128 * fVar158 + fVar110 * fVar174;
        fVar254 = local_1f8 * fVar112 + local_298 * fVar142 + fVar128 * fVar160 + fVar110 * fVar191;
        fVar255 = local_1f8 * fVar119 + local_298 * fVar163 + fVar128 * fVar169 + fVar110 * fVar194;
        fVar199 = *(float *)(catmullrom_basis1 + lVar10 + 0x1210);
        fVar204 = *(float *)(catmullrom_basis1 + lVar10 + 0x1214);
        fVar205 = *(float *)(catmullrom_basis1 + lVar10 + 0x1218);
        fVar206 = *(float *)(catmullrom_basis1 + lVar10 + 0x121c);
        fVar208 = *(float *)(catmullrom_basis1 + lVar10 + 0x1b18);
        fVar209 = *(float *)(catmullrom_basis1 + lVar10 + 0x1b1c);
        fVar210 = *(float *)(catmullrom_basis1 + lVar10 + 0x1b20);
        fVar212 = *(float *)(catmullrom_basis1 + lVar10 + 0x1b24);
        fVar214 = *(float *)(catmullrom_basis1 + lVar10 + 0x1f9c);
        fVar230 = *(float *)(catmullrom_basis1 + lVar10 + 0x1fa0);
        fVar193 = *(float *)(catmullrom_basis1 + lVar10 + 0x1fa4);
        fVar196 = *(float *)(catmullrom_basis1 + lVar10 + 0x1fa8);
        auVar133._0_4_ = fVar128 * fVar208 + fVar110 * fVar214;
        auVar133._4_4_ = fVar128 * fVar209 + fVar110 * fVar230;
        auVar133._8_4_ = fVar128 * fVar210 + fVar110 * fVar193;
        auVar133._12_4_ = fVar128 * fVar212 + fVar110 * fVar196;
        fVar198 = *(float *)(catmullrom_basis1 + lVar10 + 0x1694);
        fVar211 = *(float *)(catmullrom_basis1 + lVar10 + 0x1698);
        fVar213 = *(float *)(catmullrom_basis1 + lVar10 + 0x169c);
        fVar215 = *(float *)(catmullrom_basis1 + lVar10 + 0x16a0);
        fVar145 = local_1e8 * fVar199 + local_368 * fVar198 + fVar127 * fVar208 + fVar95 * fVar214;
        fVar159 = local_1e8 * fVar204 + local_368 * fVar211 + fVar127 * fVar209 + fVar95 * fVar230;
        fVar161 = local_1e8 * fVar205 + local_368 * fVar213 + fVar127 * fVar210 + fVar95 * fVar193;
        fVar162 = local_1e8 * fVar206 + local_368 * fVar215 + fVar127 * fVar212 + fVar95 * fVar196;
        fVar175 = local_1f8 * fVar199 + local_298 * fVar198 + auVar133._0_4_;
        fVar192 = local_1f8 * fVar204 + local_298 * fVar211 + auVar133._4_4_;
        fVar195 = local_1f8 * fVar205 + local_298 * fVar213 + auVar133._8_4_;
        fVar197 = local_1f8 * fVar206 + local_298 * fVar215 + auVar133._12_4_;
        auVar234._0_8_ = CONCAT44(fVar225,fVar217) & 0x7fffffff7fffffff;
        auVar234._8_4_ = ABS(fVar227);
        auVar234._12_4_ = ABS(fVar229);
        auVar201._0_8_ = CONCAT44(fVar253,fVar252) & 0x7fffffff7fffffff;
        auVar201._8_4_ = ABS(fVar254);
        auVar201._12_4_ = ABS(fVar255);
        auVar64 = maxps(auVar234,auVar201);
        auVar242._0_8_ =
             CONCAT44(fVar111 * fVar121 +
                      fVar141 * local_398 + fVar158 * local_348 + fVar174 * local_358,
                      fVar90 * fVar121 +
                      fVar129 * local_398 + fVar144 * local_348 + fVar171 * local_358) &
             0x7fffffff7fffffff;
        auVar242._8_4_ =
             ABS(fVar112 * fVar121 + fVar142 * local_398 + fVar160 * local_348 + fVar191 * local_358
                );
        auVar242._12_4_ =
             ABS(fVar119 * fVar121 + fVar163 * local_398 + fVar169 * local_348 + fVar194 * local_358
                );
        auVar64 = maxps(auVar64,auVar242);
        uVar46 = -(uint)(local_3a8 <= auVar64._0_4_);
        uVar47 = -(uint)(local_3a8 <= auVar64._4_4_);
        uVar48 = -(uint)(local_3a8 <= auVar64._8_4_);
        uVar49 = -(uint)(local_3a8 <= auVar64._12_4_);
        fVar144 = (float)((uint)fVar217 & uVar46 | ~uVar46 & (uint)local_388);
        fVar158 = (float)((uint)fVar225 & uVar47 | ~uVar47 & (uint)fStack_384);
        fVar171 = (float)((uint)fVar227 & uVar48 | ~uVar48 & (uint)fStack_380);
        fVar174 = (float)((uint)fVar229 & uVar49 | ~uVar49 & (uint)fStack_37c);
        fVar191 = (float)(~uVar46 & (uint)fVar238 | (uint)fVar252 & uVar46);
        fVar194 = (float)(~uVar47 & (uint)fVar239 | (uint)fVar253 & uVar47);
        fVar217 = (float)(~uVar48 & (uint)fVar240 | (uint)fVar254 & uVar48);
        fVar225 = (float)(~uVar49 & (uint)fVar143 | (uint)fVar255 & uVar49);
        auVar243._0_8_ = CONCAT44(fVar159,fVar145) & 0x7fffffff7fffffff;
        auVar243._8_4_ = ABS(fVar161);
        auVar243._12_4_ = ABS(fVar162);
        auVar207._0_8_ = CONCAT44(fVar192,fVar175) & 0x7fffffff7fffffff;
        auVar207._8_4_ = ABS(fVar195);
        auVar207._12_4_ = ABS(fVar197);
        auVar64 = maxps(auVar243,auVar207);
        auVar167._0_8_ =
             CONCAT44(fVar204 * fVar121 +
                      fVar211 * local_398 + fVar209 * local_348 + fVar230 * local_358,
                      fVar199 * fVar121 +
                      fVar198 * local_398 + fVar208 * local_348 + fVar214 * local_358) &
             0x7fffffff7fffffff;
        auVar167._8_4_ =
             ABS(fVar205 * fVar121 + fVar213 * local_398 + fVar210 * local_348 + fVar193 * local_358
                );
        auVar167._12_4_ =
             ABS(fVar206 * fVar121 + fVar215 * local_398 + fVar212 * local_348 + fVar196 * local_358
                );
        auVar64 = maxps(auVar64,auVar167);
        uVar46 = -(uint)(local_3a8 <= auVar64._0_4_);
        uVar47 = -(uint)(local_3a8 <= auVar64._4_4_);
        uVar48 = -(uint)(local_3a8 <= auVar64._8_4_);
        uVar49 = -(uint)(local_3a8 <= auVar64._12_4_);
        fVar129 = (float)((uint)fVar145 & uVar46 | ~uVar46 & (uint)local_388);
        fVar141 = (float)((uint)fVar159 & uVar47 | ~uVar47 & (uint)fStack_384);
        fVar142 = (float)((uint)fVar161 & uVar48 | ~uVar48 & (uint)fStack_380);
        fVar163 = (float)((uint)fVar162 & uVar49 | ~uVar49 & (uint)fStack_37c);
        fVar199 = (float)(~uVar46 & (uint)fVar238 | (uint)fVar175 & uVar46);
        fVar204 = (float)(~uVar47 & (uint)fVar239 | (uint)fVar192 & uVar47);
        fVar205 = (float)(~uVar48 & (uint)fVar240 | (uint)fVar195 & uVar48);
        fVar206 = (float)(~uVar49 & (uint)fVar143 | (uint)fVar197 & uVar49);
        auVar103._0_4_ = fVar191 * fVar191 + fVar144 * fVar144;
        auVar103._4_4_ = fVar194 * fVar194 + fVar158 * fVar158;
        auVar103._8_4_ = fVar217 * fVar217 + fVar171 * fVar171;
        auVar103._12_4_ = fVar225 * fVar225 + fVar174 * fVar174;
        auVar64 = rsqrtps(auVar133,auVar103);
        fVar90 = auVar64._0_4_;
        fVar111 = auVar64._4_4_;
        fVar112 = auVar64._8_4_;
        fVar119 = auVar64._12_4_;
        auVar134._0_4_ = fVar90 * fVar90 * auVar103._0_4_ * 0.5 * fVar90;
        auVar134._4_4_ = fVar111 * fVar111 * auVar103._4_4_ * 0.5 * fVar111;
        auVar134._8_4_ = fVar112 * fVar112 * auVar103._8_4_ * 0.5 * fVar112;
        auVar134._12_4_ = fVar119 * fVar119 * auVar103._12_4_ * 0.5 * fVar119;
        fVar208 = fVar90 * 1.5 - auVar134._0_4_;
        fVar209 = fVar111 * 1.5 - auVar134._4_4_;
        fVar212 = fVar112 * 1.5 - auVar134._8_4_;
        fVar230 = fVar119 * 1.5 - auVar134._12_4_;
        auVar104._0_4_ = fVar199 * fVar199 + fVar129 * fVar129;
        auVar104._4_4_ = fVar204 * fVar204 + fVar141 * fVar141;
        auVar104._8_4_ = fVar205 * fVar205 + fVar142 * fVar142;
        auVar104._12_4_ = fVar206 * fVar206 + fVar163 * fVar163;
        auVar64 = rsqrtps(auVar134,auVar104);
        fVar90 = auVar64._0_4_;
        fVar111 = auVar64._4_4_;
        fVar112 = auVar64._8_4_;
        fVar119 = auVar64._12_4_;
        fVar90 = fVar90 * 1.5 - fVar90 * fVar90 * auVar104._0_4_ * 0.5 * fVar90;
        fVar160 = fVar111 * 1.5 - fVar111 * fVar111 * auVar104._4_4_ * 0.5 * fVar111;
        fVar112 = fVar112 * 1.5 - fVar112 * fVar112 * auVar104._8_4_ * 0.5 * fVar112;
        fVar169 = fVar119 * 1.5 - fVar119 * fVar119 * auVar104._12_4_ * 0.5 * fVar119;
        fVar210 = fVar191 * fVar208 * fVar216;
        fVar214 = fVar194 * fVar209 * fVar224;
        fVar238 = fVar217 * fVar212 * fVar226;
        fVar239 = fVar225 * fVar230 * fVar228;
        fVar111 = -fVar144 * fVar208 * fVar216;
        fVar119 = -fVar158 * fVar209 * fVar224;
        fVar144 = -fVar171 * fVar212 * fVar226;
        fVar158 = -fVar174 * fVar230 * fVar228;
        fVar225 = fVar208 * 0.0 * fVar216;
        fVar227 = fVar209 * 0.0 * fVar224;
        fVar229 = fVar212 * 0.0 * fVar226;
        fVar252 = fVar230 * 0.0 * fVar228;
        fVar143 = fVar199 * fVar90 * auVar115._0_4_;
        fVar161 = fVar204 * fVar160 * auVar115._4_4_;
        fVar162 = fVar205 * fVar112 * auVar115._8_4_;
        fVar175 = fVar206 * fVar169 * auVar115._12_4_;
        fVar211 = fVar164 + fVar143;
        fVar213 = fVar170 + fVar161;
        fVar215 = fVar172 + fVar162;
        fVar145 = fVar173 + fVar175;
        fVar208 = -fVar129 * fVar90 * auVar115._0_4_;
        fVar209 = -fVar141 * fVar160 * auVar115._4_4_;
        fVar212 = -fVar142 * fVar112 * auVar115._8_4_;
        fVar230 = -fVar163 * fVar169 * auVar115._12_4_;
        fVar171 = fVar241 + fVar208;
        fVar174 = fVar247 + fVar209;
        fVar191 = fVar248 + fVar212;
        fVar194 = fVar249 + fVar230;
        fVar141 = fVar90 * 0.0 * auVar115._0_4_;
        fVar163 = fVar160 * 0.0 * auVar115._4_4_;
        fVar160 = fVar112 * 0.0 * auVar115._8_4_;
        fVar169 = fVar169 * 0.0 * auVar115._12_4_;
        fVar240 = local_378 - fVar210;
        fVar193 = fStack_374 - fVar214;
        fVar196 = fStack_370 - fVar238;
        fVar198 = fStack_36c - fVar239;
        fVar192 = fVar53 + fVar141;
        fVar195 = fVar87 + fVar163;
        fVar197 = fVar91 + fVar160;
        fVar217 = fVar93 + fVar169;
        fVar90 = local_258 - fVar111;
        fVar112 = fStack_254 - fVar119;
        fVar129 = fStack_250 - fVar144;
        fVar142 = fStack_24c - fVar158;
        fVar199 = fVar54 - fVar225;
        fVar204 = fVar88 - fVar227;
        fVar205 = fVar92 - fVar229;
        fVar206 = fVar94 - fVar252;
        uVar46 = -(uint)(0.0 < (fVar90 * (fVar192 - fVar199) - fVar199 * (fVar171 - fVar90)) * 0.0 +
                               (fVar199 * (fVar211 - fVar240) - (fVar192 - fVar199) * fVar240) * 0.0
                               + ((fVar171 - fVar90) * fVar240 - (fVar211 - fVar240) * fVar90));
        uVar47 = -(uint)(0.0 < (fVar112 * (fVar195 - fVar204) - fVar204 * (fVar174 - fVar112)) * 0.0
                               + (fVar204 * (fVar213 - fVar193) - (fVar195 - fVar204) * fVar193) *
                                 0.0 + ((fVar174 - fVar112) * fVar193 -
                                       (fVar213 - fVar193) * fVar112));
        uVar48 = -(uint)(0.0 < (fVar129 * (fVar197 - fVar205) - fVar205 * (fVar191 - fVar129)) * 0.0
                               + (fVar205 * (fVar215 - fVar196) - (fVar197 - fVar205) * fVar196) *
                                 0.0 + ((fVar191 - fVar129) * fVar196 -
                                       (fVar215 - fVar196) * fVar129));
        uVar49 = -(uint)(0.0 < (fVar142 * (fVar217 - fVar206) - fVar206 * (fVar194 - fVar142)) * 0.0
                               + (fVar206 * (fVar145 - fVar198) - (fVar217 - fVar206) * fVar198) *
                                 0.0 + ((fVar194 - fVar142) * fVar198 -
                                       (fVar145 - fVar198) * fVar142));
        fVar159 = (float)((uint)(fVar164 - fVar143) & uVar46 | ~uVar46 & (uint)(local_378 + fVar210)
                         );
        fVar161 = (float)((uint)(fVar170 - fVar161) & uVar47 |
                         ~uVar47 & (uint)(fStack_374 + fVar214));
        fVar162 = (float)((uint)(fVar172 - fVar162) & uVar48 |
                         ~uVar48 & (uint)(fStack_370 + fVar238));
        fVar175 = (float)((uint)(fVar173 - fVar175) & uVar49 |
                         ~uVar49 & (uint)(fStack_36c + fVar239));
        fVar208 = (float)((uint)(fVar241 - fVar208) & uVar46 | ~uVar46 & (uint)(local_258 + fVar111)
                         );
        fVar210 = (float)((uint)(fVar247 - fVar209) & uVar47 |
                         ~uVar47 & (uint)(fStack_254 + fVar119));
        fVar214 = (float)((uint)(fVar248 - fVar212) & uVar48 |
                         ~uVar48 & (uint)(fStack_250 + fVar144));
        fVar238 = (float)((uint)(fVar249 - fVar230) & uVar49 |
                         ~uVar49 & (uint)(fStack_24c + fVar158));
        fVar144 = (float)((uint)(fVar53 - fVar141) & uVar46 | ~uVar46 & (uint)(fVar54 + fVar225));
        fVar158 = (float)((uint)(fVar87 - fVar163) & uVar47 | ~uVar47 & (uint)(fVar88 + fVar227));
        fVar160 = (float)((uint)(fVar91 - fVar160) & uVar48 | ~uVar48 & (uint)(fVar92 + fVar229));
        fVar169 = (float)((uint)(fVar93 - fVar169) & uVar49 | ~uVar49 & (uint)(fVar94 + fVar252));
        fVar143 = (float)((uint)fVar240 & uVar46 | ~uVar46 & (uint)fVar211);
        fVar164 = (float)((uint)fVar193 & uVar47 | ~uVar47 & (uint)fVar213);
        fVar170 = (float)((uint)fVar196 & uVar48 | ~uVar48 & (uint)fVar215);
        fVar172 = (float)((uint)fVar198 & uVar49 | ~uVar49 & (uint)fVar145);
        fVar111 = (float)((uint)fVar90 & uVar46 | ~uVar46 & (uint)fVar171);
        fVar119 = (float)((uint)fVar112 & uVar47 | ~uVar47 & (uint)fVar174);
        fVar141 = (float)((uint)fVar129 & uVar48 | ~uVar48 & (uint)fVar191);
        fVar163 = (float)((uint)fVar142 & uVar49 | ~uVar49 & (uint)fVar194);
        fVar209 = (float)((uint)fVar199 & uVar46 | ~uVar46 & (uint)fVar192);
        fVar212 = (float)((uint)fVar204 & uVar47 | ~uVar47 & (uint)fVar195);
        fVar230 = (float)((uint)fVar205 & uVar48 | ~uVar48 & (uint)fVar197);
        fVar239 = (float)((uint)fVar206 & uVar49 | ~uVar49 & (uint)fVar217);
        fVar240 = (float)((uint)fVar211 & uVar46 | ~uVar46 & (uint)fVar240) - fVar159;
        fVar173 = (float)((uint)fVar213 & uVar47 | ~uVar47 & (uint)fVar193) - fVar161;
        fVar241 = (float)((uint)fVar215 & uVar48 | ~uVar48 & (uint)fVar196) - fVar162;
        fVar247 = (float)((uint)fVar145 & uVar49 | ~uVar49 & (uint)fVar198) - fVar175;
        fVar171 = (float)((uint)fVar171 & uVar46 | ~uVar46 & (uint)fVar90) - fVar208;
        fVar174 = (float)((uint)fVar174 & uVar47 | ~uVar47 & (uint)fVar112) - fVar210;
        fVar191 = (float)((uint)fVar191 & uVar48 | ~uVar48 & (uint)fVar129) - fVar214;
        fVar194 = (float)((uint)fVar194 & uVar49 | ~uVar49 & (uint)fVar142) - fVar238;
        fVar248 = (float)((uint)fVar192 & uVar46 | ~uVar46 & (uint)fVar199) - fVar144;
        fVar249 = (float)((uint)fVar195 & uVar47 | ~uVar47 & (uint)fVar204) - fVar158;
        fVar193 = (float)((uint)fVar197 & uVar48 | ~uVar48 & (uint)fVar205) - fVar160;
        fVar196 = (float)((uint)fVar217 & uVar49 | ~uVar49 & (uint)fVar206) - fVar169;
        fVar53 = fVar159 - fVar143;
        fVar54 = fVar161 - fVar164;
        fVar87 = fVar162 - fVar170;
        fVar88 = fVar175 - fVar172;
        fVar199 = fVar208 - fVar111;
        fVar204 = fVar210 - fVar119;
        fVar205 = fVar214 - fVar141;
        fVar206 = fVar238 - fVar163;
        fVar90 = fVar144 - fVar209;
        fVar112 = fVar158 - fVar212;
        fVar129 = fVar160 - fVar230;
        fVar142 = fVar169 - fVar239;
        fVar198 = (fVar208 * fVar248 - fVar144 * fVar171) * 0.0 +
                  (fVar144 * fVar240 - fVar159 * fVar248) * 0.0 +
                  (fVar159 * fVar171 - fVar208 * fVar240);
        fVar211 = (fVar210 * fVar249 - fVar158 * fVar174) * 0.0 +
                  (fVar158 * fVar173 - fVar161 * fVar249) * 0.0 +
                  (fVar161 * fVar174 - fVar210 * fVar173);
        auVar123._4_4_ = fVar211;
        auVar123._0_4_ = fVar198;
        fVar213 = (fVar214 * fVar193 - fVar160 * fVar191) * 0.0 +
                  (fVar160 * fVar241 - fVar162 * fVar193) * 0.0 +
                  (fVar162 * fVar191 - fVar214 * fVar241);
        fVar215 = (fVar238 * fVar196 - fVar169 * fVar194) * 0.0 +
                  (fVar169 * fVar247 - fVar175 * fVar196) * 0.0 +
                  (fVar175 * fVar194 - fVar238 * fVar247);
        auVar250._0_4_ =
             (fVar111 * fVar90 - fVar209 * fVar199) * 0.0 +
             (fVar209 * fVar53 - fVar143 * fVar90) * 0.0 + (fVar143 * fVar199 - fVar111 * fVar53);
        auVar250._4_4_ =
             (fVar119 * fVar112 - fVar212 * fVar204) * 0.0 +
             (fVar212 * fVar54 - fVar164 * fVar112) * 0.0 + (fVar164 * fVar204 - fVar119 * fVar54);
        auVar250._8_4_ =
             (fVar141 * fVar129 - fVar230 * fVar205) * 0.0 +
             (fVar230 * fVar87 - fVar170 * fVar129) * 0.0 + (fVar170 * fVar205 - fVar141 * fVar87);
        auVar250._12_4_ =
             (fVar163 * fVar142 - fVar239 * fVar206) * 0.0 +
             (fVar239 * fVar88 - fVar172 * fVar142) * 0.0 + (fVar172 * fVar206 - fVar163 * fVar88);
        auVar123._8_4_ = fVar213;
        auVar123._12_4_ = fVar215;
        auVar64 = maxps(auVar123,auVar250);
        bVar31 = auVar64._0_4_ <= 0.0 && bVar31;
        auVar124._0_4_ = -(uint)bVar31;
        bVar32 = auVar64._4_4_ <= 0.0 && bVar32;
        auVar124._4_4_ = -(uint)bVar32;
        bVar30 = auVar64._8_4_ <= 0.0 && bVar30;
        auVar124._8_4_ = -(uint)bVar30;
        bVar42 = auVar64._12_4_ <= 0.0 && bVar42;
        auVar124._12_4_ = -(uint)bVar42;
        iVar34 = movmskps(iVar34,auVar124);
        if (iVar34 == 0) {
LAB_00a8b8e4:
          auVar79._8_8_ = uStack_3b0;
          auVar79._0_8_ = local_3b8;
        }
        else {
          fVar209 = fVar199 * fVar248 - fVar90 * fVar171;
          fVar212 = fVar204 * fVar249 - fVar112 * fVar174;
          fVar230 = fVar205 * fVar193 - fVar129 * fVar191;
          fVar239 = fVar206 * fVar196 - fVar142 * fVar194;
          auVar13._4_4_ = fVar173;
          auVar13._0_4_ = fVar240;
          auVar13._8_4_ = fVar241;
          auVar13._12_4_ = fVar247;
          fVar90 = fVar90 * fVar240 - fVar248 * fVar53;
          fVar112 = fVar112 * fVar173 - fVar249 * fVar54;
          fVar129 = fVar129 * fVar241 - fVar193 * fVar87;
          fVar142 = fVar142 * fVar247 - fVar196 * fVar88;
          fVar171 = fVar53 * fVar171 - fVar199 * fVar240;
          fVar174 = fVar54 * fVar174 - fVar204 * fVar173;
          fVar191 = fVar87 * fVar191 - fVar205 * fVar241;
          fVar194 = fVar88 * fVar194 - fVar206 * fVar247;
          auVar154._0_4_ = fVar209 * 0.0 + fVar90 * 0.0 + fVar171;
          auVar154._4_4_ = fVar212 * 0.0 + fVar112 * 0.0 + fVar174;
          auVar154._8_4_ = fVar230 * 0.0 + fVar129 * 0.0 + fVar191;
          auVar154._12_4_ = fVar239 * 0.0 + fVar142 * 0.0 + fVar194;
          auVar64 = rcpps(auVar13,auVar154);
          fVar111 = auVar64._0_4_;
          fVar119 = auVar64._4_4_;
          fVar141 = auVar64._8_4_;
          fVar163 = auVar64._12_4_;
          fVar111 = (1.0 - auVar154._0_4_ * fVar111) * fVar111 + fVar111;
          fVar119 = (1.0 - auVar154._4_4_ * fVar119) * fVar119 + fVar119;
          fVar141 = (1.0 - auVar154._8_4_ * fVar141) * fVar141 + fVar141;
          fVar163 = (1.0 - auVar154._12_4_ * fVar163) * fVar163 + fVar163;
          fVar144 = (fVar144 * fVar171 + fVar208 * fVar90 + fVar159 * fVar209) * fVar111;
          fVar112 = (fVar158 * fVar174 + fVar210 * fVar112 + fVar161 * fVar212) * fVar119;
          auVar222._4_4_ = fVar112;
          auVar222._0_4_ = fVar144;
          fVar129 = (fVar160 * fVar191 + fVar214 * fVar129 + fVar162 * fVar230) * fVar141;
          fVar142 = (fVar169 * fVar194 + fVar238 * fVar142 + fVar175 * fVar239) * fVar163;
          fVar90 = *(float *)(ray + k * 4 + 0x80);
          bVar31 = (fVar86 <= fVar144 && fVar144 <= fVar90) && bVar31;
          auVar135._0_4_ = -(uint)bVar31;
          bVar32 = (fVar86 <= fVar112 && fVar112 <= fVar90) && bVar32;
          auVar135._4_4_ = -(uint)bVar32;
          bVar30 = (fVar86 <= fVar129 && fVar129 <= fVar90) && bVar30;
          auVar135._8_4_ = -(uint)bVar30;
          bVar42 = (fVar86 <= fVar142 && fVar142 <= fVar90) && bVar42;
          auVar135._12_4_ = -(uint)bVar42;
          iVar34 = movmskps(iVar34,auVar135);
          if (iVar34 == 0) goto LAB_00a8b8e4;
          auVar136._0_8_ =
               CONCAT44(-(uint)(auVar154._4_4_ != 0.0 && bVar32),
                        -(uint)(auVar154._0_4_ != 0.0 && bVar31));
          auVar136._8_4_ = -(uint)(auVar154._8_4_ != 0.0 && bVar30);
          auVar136._12_4_ = -(uint)(auVar154._12_4_ != 0.0 && bVar42);
          iVar34 = movmskps(iVar34,auVar136);
          auVar79._8_8_ = uStack_3b0;
          auVar79._0_8_ = local_3b8;
          if (iVar34 != 0) {
            fVar198 = fVar198 * fVar111;
            fVar211 = fVar211 * fVar119;
            fVar213 = fVar213 * fVar141;
            fVar215 = fVar215 * fVar163;
            auVar78._0_4_ = ~uVar46 & (uint)fVar198;
            auVar78._4_4_ = ~uVar47 & (uint)fVar211;
            auVar78._8_4_ = ~uVar48 & (uint)fVar213;
            auVar78._12_4_ = ~uVar49 & (uint)fVar215;
            auVar202._0_4_ = (uint)(1.0 - fVar198) & uVar46;
            auVar202._4_4_ = (uint)(1.0 - fVar211) & uVar47;
            auVar202._8_4_ = (uint)(1.0 - fVar213) & uVar48;
            auVar202._12_4_ = (uint)(1.0 - fVar215) & uVar49;
            auVar203 = auVar202 | auVar78;
            local_278 = (float)(~uVar46 & (uint)(auVar250._0_4_ * fVar111) |
                               (uint)(1.0 - auVar250._0_4_ * fVar111) & uVar46);
            fStack_274 = (float)(~uVar47 & (uint)(auVar250._4_4_ * fVar119) |
                                (uint)(1.0 - auVar250._4_4_ * fVar119) & uVar47);
            fStack_270 = (float)(~uVar48 & (uint)(auVar250._8_4_ * fVar141) |
                                (uint)(1.0 - auVar250._8_4_ * fVar141) & uVar48);
            fStack_26c = (float)(~uVar49 & (uint)(auVar250._12_4_ * fVar163) |
                                (uint)(1.0 - auVar250._12_4_ * fVar163) & uVar49);
            auVar79._8_4_ = auVar136._8_4_;
            auVar79._0_8_ = auVar136._0_8_;
            auVar79._12_4_ = auVar136._12_4_;
            auVar222._8_4_ = fVar129;
            auVar222._12_4_ = fVar142;
            auVar221 = auVar222;
          }
        }
        iVar34 = movmskps(iVar34,auVar79);
        if (iVar34 == 0) {
          bVar42 = false;
          local_4e8 = 0;
        }
        else {
          fVar216 = (auVar115._0_4_ - fVar216) * auVar203._0_4_ + fVar216;
          fVar224 = (auVar115._4_4_ - fVar224) * auVar203._4_4_ + fVar224;
          fVar226 = (auVar115._8_4_ - fVar226) * auVar203._8_4_ + fVar226;
          fVar228 = (auVar115._12_4_ - fVar228) * auVar203._12_4_ + fVar228;
          fVar86 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
          local_158._0_4_ = -(uint)(fVar86 * (fVar216 + fVar216) < auVar221._0_4_) & auVar79._0_4_;
          local_158._4_4_ = -(uint)(fVar86 * (fVar224 + fVar224) < auVar221._4_4_) & auVar79._4_4_;
          local_158._8_4_ = -(uint)(fVar86 * (fVar226 + fVar226) < auVar221._8_4_) & auVar79._8_4_;
          local_158._12_4_ =
               -(uint)(fVar86 * (fVar228 + fVar228) < auVar221._12_4_) & auVar79._12_4_;
          local_4e8 = movmskps(iVar34,local_158);
          if (local_4e8 != 0) {
            local_278 = local_278 + local_278 + -1.0;
            fStack_274 = fStack_274 + fStack_274 + -1.0;
            fStack_270 = fStack_270 + fStack_270 + -1.0;
            fStack_26c = fStack_26c + fStack_26c + -1.0;
            local_1a8 = 0;
            if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar42 = true, pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar89 = 1.0 / fVar89;
                local_148[0] = fVar89 * (auVar203._0_4_ + 0.0);
                local_148[1] = fVar89 * (auVar203._4_4_ + 1.0);
                local_148[2] = fVar89 * (auVar203._8_4_ + 2.0);
                local_148[3] = fVar89 * (auVar203._12_4_ + 3.0);
                local_138 = CONCAT44(fStack_274,local_278);
                uStack_130 = CONCAT44(fStack_26c,fStack_270);
                local_128 = auVar221;
                pGVar41 = (Geometry *)(ulong)(byte)local_4e8;
                uVar43 = 0;
                if (pGVar41 != (Geometry *)0x0) {
                  for (; ((byte)local_4e8 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                  }
                }
                local_428 = CONCAT44((uint)uStack_420,(uint)uStack_420);
                uStack_420._4_4_ = (uint)uStack_420;
                local_478 = CONCAT44((uint)uStack_470,(uint)uStack_470);
                uStack_470._4_4_ = (uint)uStack_470;
                auVar64 = *local_330;
                uVar6 = *(undefined4 *)(ray + k * 4 + 0x80);
                _local_1d8 = auVar203;
                local_1c8 = local_278;
                fStack_1c4 = fStack_274;
                fStack_1c0 = fStack_270;
                fStack_1bc = fStack_26c;
                local_1b8 = auVar221;
                local_1a4 = iVar7;
                local_188 = fVar120;
                fStack_184 = fVar51;
                fStack_180 = fVar52;
                fStack_17c = fVar85;
                do {
                  local_e8 = local_148[uVar43];
                  local_4e8 = (uint)uVar43;
                  local_d8 = *(undefined4 *)((long)&local_138 + uVar43 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_128 + uVar43 * 4);
                  fVar112 = 1.0 - local_e8;
                  fVar86 = local_e8 * 3.0;
                  fVar111 = ((fVar86 + 2.0) * (fVar112 + fVar112) + fVar112 * -3.0 * fVar112) * 0.5;
                  fVar89 = (local_e8 * local_e8 + fVar112 * -2.0 * local_e8) * 0.5;
                  fVar90 = (local_e8 * fVar86 + (fVar86 + -5.0) * (local_e8 + local_e8)) * 0.5;
                  local_328.context = context->user;
                  fVar86 = (local_e8 * (fVar112 + fVar112) - fVar112 * fVar112) * 0.5;
                  local_118 = fVar86 * local_2b8 +
                              fVar90 * fVar120 + fVar111 * local_2c8 + fVar89 * local_2d8;
                  local_108 = fVar86 * fStack_2b4 +
                              fVar90 * fVar51 + fVar111 * fStack_2c4 + fVar89 * fStack_2d4;
                  local_f8 = fVar86 * fStack_2b0 +
                             fVar90 * fVar52 + fVar111 * fStack_2c0 + fVar89 * fStack_2d0;
                  fStack_114 = local_118;
                  fStack_110 = local_118;
                  fStack_10c = local_118;
                  fStack_104 = local_108;
                  fStack_100 = local_108;
                  fStack_fc = local_108;
                  fStack_f4 = local_f8;
                  fStack_f0 = local_f8;
                  fStack_ec = local_f8;
                  fStack_e4 = local_e8;
                  fStack_e0 = local_e8;
                  fStack_dc = local_e8;
                  uStack_d4 = local_d8;
                  uStack_d0 = local_d8;
                  uStack_cc = local_d8;
                  local_c8 = local_478;
                  uStack_c0 = uStack_470;
                  local_b8 = local_428;
                  uStack_b0 = uStack_420;
                  local_a8 = (local_328.context)->instID[0];
                  uStack_a4 = local_a8;
                  uStack_a0 = local_a8;
                  uStack_9c = local_a8;
                  local_98 = (local_328.context)->instPrimID[0];
                  uStack_94 = local_98;
                  uStack_90 = local_98;
                  uStack_8c = local_98;
                  local_328.valid = (int *)local_3d8;
                  local_328.geometryUserPtr = pGVar8->userPtr;
                  local_328.hit = (RTCHitN *)&local_118;
                  local_328.N = 4;
                  p_Var36 = pGVar8->occlusionFilterN;
                  local_3d8 = auVar64;
                  local_328.ray = (RTCRayN *)ray;
                  if (p_Var36 != (RTCFilterFunctionN)0x0) {
                    p_Var36 = (RTCFilterFunctionN)(*p_Var36)(&local_328);
                  }
                  auVar105._0_4_ = -(uint)(local_3d8._0_4_ == 0);
                  auVar105._4_4_ = -(uint)(local_3d8._4_4_ == 0);
                  auVar105._8_4_ = -(uint)(local_3d8._8_4_ == 0);
                  auVar105._12_4_ = -(uint)(local_3d8._12_4_ == 0);
                  uVar46 = movmskps((int)p_Var36,auVar105);
                  pRVar37 = (RTCRayN *)(ulong)(uVar46 ^ 0xf);
                  if ((uVar46 ^ 0xf) == 0) {
                    auVar105 = auVar105 ^ _DAT_01f7ae20;
                  }
                  else {
                    p_Var36 = context->args->filter;
                    if ((p_Var36 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var36)(&local_328);
                    }
                    auVar80._0_4_ = -(uint)(local_3d8._0_4_ == 0);
                    auVar80._4_4_ = -(uint)(local_3d8._4_4_ == 0);
                    auVar80._8_4_ = -(uint)(local_3d8._8_4_ == 0);
                    auVar80._12_4_ = -(uint)(local_3d8._12_4_ == 0);
                    auVar105 = auVar80 ^ _DAT_01f7ae20;
                    *(undefined1 (*) [16])(local_328.ray + 0x80) =
                         ~auVar80 & _DAT_01f7aa00 |
                         *(undefined1 (*) [16])(local_328.ray + 0x80) & auVar80;
                    pRVar37 = local_328.ray;
                  }
                  auVar106._0_4_ = auVar105._0_4_ << 0x1f;
                  auVar106._4_4_ = auVar105._4_4_ << 0x1f;
                  auVar106._8_4_ = auVar105._8_4_ << 0x1f;
                  auVar106._12_4_ = auVar105._12_4_ << 0x1f;
                  iVar34 = movmskps((int)pRVar37,auVar106);
                  if (iVar34 != 0) {
                    bVar42 = true;
                    break;
                  }
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar6;
                  pGVar41 = (Geometry *)((ulong)pGVar41 ^ 1L << (uVar43 & 0x3f));
                  uVar43 = 0;
                  if (pGVar41 != (Geometry *)0x0) {
                    for (; ((ulong)pGVar41 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                    }
                  }
                  bVar42 = false;
                } while (pGVar41 != (Geometry *)0x0);
              }
              goto LAB_00a8b890;
            }
          }
          bVar42 = false;
        }
      }
LAB_00a8b890:
      if (4 < iVar7) {
        local_58 = iVar7;
        iStack_54 = iVar7;
        iStack_50 = iVar7;
        iStack_4c = iVar7;
        fStack_3a4 = local_3a8;
        fStack_3a0 = local_3a8;
        fStack_39c = local_3a8;
        local_2a8._4_4_ = local_2a8._0_4_;
        fStack_2a0 = (float)local_2a8._0_4_;
        fStack_29c = (float)local_2a8._0_4_;
        local_88 = 1.0 / (float)local_2f8._0_4_;
        fStack_84 = local_88;
        fStack_80 = local_88;
        fStack_7c = local_88;
        local_68 = (undefined4)local_3c0;
        uStack_64 = (undefined4)local_3c0;
        uStack_60 = (undefined4)local_3c0;
        uStack_5c = (undefined4)local_3c0;
        local_78 = (undefined4)local_2e8;
        uStack_74 = (undefined4)local_2e8;
        uStack_70 = (undefined4)local_2e8;
        uStack_6c = (undefined4)local_2e8;
        lVar44 = 4;
        do {
          local_1a8 = (uint)lVar44;
          pauVar2 = (undefined1 (*) [12])(catmullrom_basis0 + lVar44 * 4 + lVar10);
          fVar86 = *(float *)*pauVar2;
          fVar89 = *(float *)(*pauVar2 + 4);
          fVar90 = *(float *)(*pauVar2 + 8);
          auVar16 = *pauVar2;
          fVar111 = *(float *)pauVar2[1];
          pfVar1 = (float *)(lVar10 + 0x21b37f0 + lVar44 * 4);
          local_388 = *pfVar1;
          fStack_384 = pfVar1[1];
          fStack_380 = pfVar1[2];
          fStack_37c = pfVar1[3];
          pauVar4 = (undefined1 (*) [16])(lVar10 + 0x21b3c74 + lVar44 * 4);
          fVar112 = *(float *)*pauVar4;
          fVar119 = *(float *)(*pauVar4 + 4);
          fVar129 = *(float *)(*pauVar4 + 8);
          auVar15 = *(undefined1 (*) [12])*pauVar4;
          fVar141 = *(float *)(*pauVar4 + 0xc);
          pfVar1 = (float *)(lVar10 + 0x21b40f8 + lVar44 * 4);
          fVar142 = *pfVar1;
          fVar163 = pfVar1[1];
          fVar144 = pfVar1[2];
          fVar158 = pfVar1[3];
          fVar240 = local_1e8 * fVar86 +
                    local_368 * local_388 + fVar127 * fVar112 + fVar95 * fVar142;
          fVar143 = fStack_1e4 * fVar89 +
                    fStack_364 * fStack_384 + fVar127 * fVar119 + fVar95 * fVar163;
          fVar164 = fStack_1e0 * fVar90 +
                    fStack_360 * fStack_380 + fVar127 * fVar129 + fVar95 * fVar144;
          fVar170 = fStack_1dc * fVar111 +
                    fStack_35c * fStack_37c + fVar127 * fVar141 + fVar95 * fVar158;
          local_258 = local_1f8 * fVar86 +
                      local_298 * local_388 + fVar128 * fVar112 + fVar110 * fVar142;
          fStack_254 = fStack_1f4 * fVar89 +
                       fStack_294 * fStack_384 + fVar128 * fVar119 + fVar110 * fVar163;
          fStack_250 = fStack_1f0 * fVar90 +
                       fStack_290 * fStack_380 + fVar128 * fVar129 + fVar110 * fVar144;
          fStack_24c = fStack_1ec * fVar111 +
                       fStack_28c * fStack_37c + fVar128 * fVar141 + fVar110 * fVar158;
          auVar244._0_4_ =
               local_238 * fVar86 +
               local_228 * local_388 + local_208 * fVar112 + local_218 * fVar142;
          auVar244._4_4_ =
               fStack_234 * fVar89 +
               fStack_224 * fStack_384 + fStack_204 * fVar119 + fStack_214 * fVar163;
          auVar244._8_4_ =
               fStack_230 * fVar90 +
               fStack_220 * fStack_380 + fStack_200 * fVar129 + fStack_210 * fVar144;
          auVar244._12_4_ =
               fStack_22c * fVar111 +
               fStack_21c * fStack_37c + fStack_1fc * fVar141 + fStack_20c * fVar158;
          puVar38 = catmullrom_basis1 + lVar10;
          pfVar1 = (float *)(puVar38 + lVar44 * 4);
          fVar86 = *pfVar1;
          fVar89 = pfVar1[1];
          fVar90 = pfVar1[2];
          fVar112 = pfVar1[3];
          pfVar1 = (float *)(lVar10 + 0x21b5c10 + lVar44 * 4);
          fVar119 = *pfVar1;
          fVar129 = pfVar1[1];
          fVar160 = pfVar1[2];
          fVar169 = pfVar1[3];
          pfVar1 = (float *)(lVar10 + 0x21b6094 + lVar44 * 4);
          fVar171 = *pfVar1;
          fVar174 = pfVar1[1];
          fVar191 = pfVar1[2];
          fVar194 = pfVar1[3];
          pfVar1 = (float *)(lVar10 + 0x21b6518 + lVar44 * 4);
          fVar199 = *pfVar1;
          fVar204 = pfVar1[1];
          fVar205 = pfVar1[2];
          fVar206 = pfVar1[3];
          fVar214 = local_1e8 * fVar86 + local_368 * fVar119 + fVar127 * fVar171 + fVar95 * fVar199;
          fVar216 = fStack_1e4 * fVar89 +
                    fStack_364 * fVar129 + fVar127 * fVar174 + fVar95 * fVar204;
          fVar224 = fStack_1e0 * fVar90 +
                    fStack_360 * fVar160 + fVar127 * fVar191 + fVar95 * fVar205;
          fVar226 = fStack_1dc * fVar112 +
                    fStack_35c * fVar169 + fVar127 * fVar194 + fVar95 * fVar206;
          fVar228 = local_1f8 * fVar86 + local_298 * fVar119 + fVar128 * fVar171 + fVar110 * fVar199
          ;
          fVar230 = fStack_1f4 * fVar89 +
                    fStack_294 * fVar129 + fVar128 * fVar174 + fVar110 * fVar204;
          fVar238 = fStack_1f0 * fVar90 +
                    fStack_290 * fVar160 + fVar128 * fVar191 + fVar110 * fVar205;
          fVar239 = fStack_1ec * fVar112 +
                    fStack_28c * fVar169 + fVar128 * fVar194 + fVar110 * fVar206;
          auVar235._0_4_ =
               local_238 * fVar86 + local_228 * fVar119 + local_208 * fVar171 + local_218 * fVar199;
          auVar235._4_4_ =
               fStack_234 * fVar89 +
               fStack_224 * fVar129 + fStack_204 * fVar174 + fStack_214 * fVar204;
          auVar235._8_4_ =
               fStack_230 * fVar90 +
               fStack_220 * fVar160 + fStack_200 * fVar191 + fStack_210 * fVar205;
          auVar235._12_4_ =
               fStack_22c * fVar112 +
               fStack_21c * fVar169 + fStack_1fc * fVar194 + fStack_20c * fVar206;
          local_2f8._0_4_ = fVar214 - fVar240;
          local_2f8._4_4_ = fVar216 - fVar143;
          fStack_2f0 = fVar224 - fVar164;
          fStack_2ec = fVar226 - fVar170;
          fVar208 = fVar228 - local_258;
          fVar209 = fVar230 - fStack_254;
          fVar210 = fVar238 - fStack_250;
          fVar212 = fVar239 - fStack_24c;
          fVar172 = local_258 * (float)local_2f8._0_4_ - fVar240 * fVar208;
          fVar173 = fStack_254 * (float)local_2f8._4_4_ - fVar143 * fVar209;
          fVar241 = fStack_250 * fStack_2f0 - fVar164 * fVar210;
          fVar247 = fStack_24c * fStack_2ec - fVar170 * fVar212;
          auVar64 = maxps(auVar244,auVar235);
          bVar31 = fVar172 * fVar172 <=
                   auVar64._0_4_ * auVar64._0_4_ *
                   ((float)local_2f8._0_4_ * (float)local_2f8._0_4_ + fVar208 * fVar208) &&
                   (int)local_1a8 < local_58;
          auVar190._0_4_ = -(uint)bVar31;
          bVar30 = (int)(local_1a8 | 1) < iStack_54 &&
                   fVar173 * fVar173 <=
                   auVar64._4_4_ * auVar64._4_4_ *
                   ((float)local_2f8._4_4_ * (float)local_2f8._4_4_ + fVar209 * fVar209);
          auVar190._4_4_ = -(uint)bVar30;
          bVar32 = fVar241 * fVar241 <=
                   auVar64._8_4_ * auVar64._8_4_ * (fStack_2f0 * fStack_2f0 + fVar210 * fVar210) &&
                   (int)(local_1a8 | 2) < iStack_50;
          auVar190._8_4_ = -(uint)bVar32;
          bVar33 = fVar247 * fVar247 <=
                   auVar64._12_4_ * auVar64._12_4_ * (fStack_2ec * fStack_2ec + fVar212 * fVar212)
                   && (int)(local_1a8 | 3) < iStack_4c;
          auVar190._12_4_ = -(uint)bVar33;
          uVar46 = movmskps((int)pGVar41,auVar190);
          pGVar41 = (Geometry *)(ulong)uVar46;
          if (uVar46 != 0) {
            local_2e8 = CONCAT44(fVar209,fVar208);
            fVar87 = fVar199 * local_358 + fVar171 * local_348 + fVar119 * local_398 +
                     fVar86 * fVar121;
            fVar91 = fVar204 * fStack_354 + fVar174 * fStack_344 + fVar129 * fStack_394 +
                     fVar89 * fVar121;
            fVar93 = fVar205 * fStack_350 + fVar191 * fStack_340 + fVar160 * fStack_390 +
                     fVar90 * fVar121;
            fVar145 = fVar206 * fStack_34c + fVar194 * fStack_33c + fVar169 * fStack_38c +
                      fVar112 * fVar121;
            local_418 = auVar16._0_4_;
            fStack_414 = auVar16._4_4_;
            fStack_410 = auVar16._8_4_;
            local_268._0_4_ = auVar15._0_4_;
            local_268._4_4_ = auVar15._4_4_;
            fStack_260 = auVar15._8_4_;
            fVar88 = fVar142 * local_358 + (float)local_268._0_4_ * local_348 +
                     local_388 * local_398 + local_418 * fVar121;
            fVar92 = fVar163 * fStack_354 + (float)local_268._4_4_ * fStack_344 +
                     fStack_384 * fStack_394 + fStack_414 * fVar121;
            fVar94 = fVar144 * fStack_350 + fStack_260 * fStack_340 + fStack_380 * fStack_390 +
                     fStack_410 * fVar121;
            fVar159 = fVar158 * fStack_34c + fVar141 * fStack_33c + fStack_37c * fStack_38c +
                      fVar111 * fVar121;
            pfVar1 = (float *)(lVar10 + 0x21b457c + lVar44 * 4);
            fVar86 = *pfVar1;
            fVar89 = pfVar1[1];
            fVar90 = pfVar1[2];
            fVar111 = pfVar1[3];
            pfVar1 = (float *)(lVar10 + 0x21b4a00 + lVar44 * 4);
            fVar112 = *pfVar1;
            fVar119 = pfVar1[1];
            fVar129 = pfVar1[2];
            fVar141 = pfVar1[3];
            pfVar1 = (float *)(lVar10 + 0x21b4e84 + lVar44 * 4);
            fVar142 = *pfVar1;
            fVar163 = pfVar1[1];
            fVar144 = pfVar1[2];
            fVar158 = pfVar1[3];
            pfVar1 = (float *)(lVar10 + 0x21b5308 + lVar44 * 4);
            fVar160 = *pfVar1;
            fVar169 = pfVar1[1];
            fVar171 = pfVar1[2];
            fVar174 = pfVar1[3];
            fVar195 = local_1e8 * fVar86 +
                      local_368 * fVar112 + fVar127 * fVar142 + fVar95 * fVar160;
            fVar197 = fStack_1e4 * fVar89 +
                      fStack_364 * fVar119 + fVar127 * fVar163 + fVar95 * fVar169;
            fVar217 = fStack_1e0 * fVar90 +
                      fStack_360 * fVar129 + fVar127 * fVar144 + fVar95 * fVar171;
            fVar225 = fStack_1dc * fVar111 +
                      fStack_35c * fVar141 + fVar127 * fVar158 + fVar95 * fVar174;
            fVar213 = local_1f8 * fVar86 +
                      local_298 * fVar112 + fVar128 * fVar142 + fVar110 * fVar160;
            fVar215 = fStack_1f4 * fVar89 +
                      fStack_294 * fVar119 + fVar128 * fVar163 + fVar110 * fVar169;
            fVar53 = fStack_1f0 * fVar90 +
                     fStack_290 * fVar129 + fVar128 * fVar144 + fVar110 * fVar171;
            fVar54 = fStack_1ec * fVar111 +
                     fStack_28c * fVar141 + fVar128 * fVar158 + fVar110 * fVar174;
            pfVar1 = (float *)(lVar10 + 0x21b699c + lVar44 * 4);
            fVar191 = *pfVar1;
            fVar194 = pfVar1[1];
            fVar199 = pfVar1[2];
            fVar204 = pfVar1[3];
            pfVar1 = (float *)(lVar10 + 0x21b72a4 + lVar44 * 4);
            fVar205 = *pfVar1;
            fVar206 = pfVar1[1];
            fVar172 = pfVar1[2];
            fVar173 = pfVar1[3];
            pfVar1 = (float *)(lVar10 + 0x21b7728 + lVar44 * 4);
            fVar241 = *pfVar1;
            fVar247 = pfVar1[1];
            fVar248 = pfVar1[2];
            fVar249 = pfVar1[3];
            pfVar1 = (float *)(lVar10 + 0x21b6e20 + lVar44 * 4);
            fVar193 = *pfVar1;
            fVar196 = pfVar1[1];
            fVar198 = pfVar1[2];
            fVar211 = pfVar1[3];
            fVar227 = local_1e8 * fVar191 +
                      local_368 * fVar193 + fVar127 * fVar205 + fVar95 * fVar241;
            fVar229 = fStack_1e4 * fVar194 +
                      fStack_364 * fVar196 + fVar127 * fVar206 + fVar95 * fVar247;
            fVar252 = fStack_1e0 * fVar199 +
                      fStack_360 * fVar198 + fVar127 * fVar172 + fVar95 * fVar248;
            fVar253 = fStack_1dc * fVar204 +
                      fStack_35c * fVar211 + fVar127 * fVar173 + fVar95 * fVar249;
            fVar161 = local_1f8 * fVar191 +
                      local_298 * fVar193 + fVar128 * fVar205 + fVar110 * fVar241;
            fVar162 = fStack_1f4 * fVar194 +
                      fStack_294 * fVar196 + fVar128 * fVar206 + fVar110 * fVar247;
            fVar175 = fStack_1f0 * fVar199 +
                      fStack_290 * fVar198 + fVar128 * fVar172 + fVar110 * fVar248;
            fVar192 = fStack_1ec * fVar204 +
                      fStack_28c * fVar211 + fVar128 * fVar173 + fVar110 * fVar249;
            auVar236._0_8_ = CONCAT44(fVar197,fVar195) & 0x7fffffff7fffffff;
            auVar236._8_4_ = ABS(fVar217);
            auVar236._12_4_ = ABS(fVar225);
            auVar155._0_8_ = CONCAT44(fVar215,fVar213) & 0x7fffffff7fffffff;
            auVar155._8_4_ = ABS(fVar53);
            auVar155._12_4_ = ABS(fVar54);
            auVar64 = maxps(auVar236,auVar155);
            auVar245._0_8_ =
                 CONCAT44(fVar89 * fVar121 +
                          fVar119 * fStack_394 + fVar163 * fStack_344 + fVar169 * fStack_354,
                          fVar86 * fVar121 +
                          fVar112 * local_398 + fVar142 * local_348 + fVar160 * local_358) &
                 0x7fffffff7fffffff;
            auVar245._8_4_ =
                 ABS(fVar90 * fVar121 +
                     fVar129 * fStack_390 + fVar144 * fStack_340 + fVar171 * fStack_350);
            auVar245._12_4_ =
                 ABS(fVar111 * fVar121 +
                     fVar141 * fStack_38c + fVar158 * fStack_33c + fVar174 * fStack_34c);
            auVar64 = maxps(auVar64,auVar245);
            uVar46 = -(uint)(local_3a8 <= auVar64._0_4_);
            uVar47 = -(uint)(fStack_3a4 <= auVar64._4_4_);
            uVar48 = -(uint)(fStack_3a0 <= auVar64._8_4_);
            uVar49 = -(uint)(fStack_39c <= auVar64._12_4_);
            auVar156._0_4_ = ~uVar46 & local_2f8._0_4_;
            auVar156._4_4_ = ~uVar47 & local_2f8._4_4_;
            auVar156._8_4_ = ~uVar48 & (uint)fStack_2f0;
            auVar156._12_4_ = ~uVar49 & (uint)fStack_2ec;
            auVar223._0_4_ = (uint)fVar195 & uVar46;
            auVar223._4_4_ = (uint)fVar197 & uVar47;
            auVar223._8_4_ = (uint)fVar217 & uVar48;
            auVar223._12_4_ = (uint)fVar225 & uVar49;
            auVar223 = auVar223 | auVar156;
            fVar163 = (float)(~uVar46 & (uint)fVar208 | (uint)fVar213 & uVar46);
            fVar158 = (float)(~uVar47 & (uint)fVar209 | (uint)fVar215 & uVar47);
            fVar213 = (float)(~uVar48 & (uint)fVar210 | (uint)fVar53 & uVar48);
            fVar215 = (float)(~uVar49 & (uint)fVar212 | (uint)fVar54 & uVar49);
            auVar246._0_8_ = CONCAT44(fVar229,fVar227) & 0x7fffffff7fffffff;
            auVar246._8_4_ = ABS(fVar252);
            auVar246._12_4_ = ABS(fVar253);
            auVar116._0_8_ = CONCAT44(fVar162,fVar161) & 0x7fffffff7fffffff;
            auVar116._8_4_ = ABS(fVar175);
            auVar116._12_4_ = ABS(fVar192);
            auVar64 = maxps(auVar246,auVar116);
            auVar81._0_8_ =
                 CONCAT44(fVar194 * fVar121 +
                          fVar196 * fStack_394 + fVar206 * fStack_344 + fVar247 * fStack_354,
                          fVar191 * fVar121 +
                          fVar193 * local_398 + fVar205 * local_348 + fVar241 * local_358) &
                 0x7fffffff7fffffff;
            auVar81._8_4_ =
                 ABS(fVar199 * fVar121 +
                     fVar198 * fStack_390 + fVar172 * fStack_340 + fVar248 * fStack_350);
            auVar81._12_4_ =
                 ABS(fVar204 * fVar121 +
                     fVar211 * fStack_38c + fVar173 * fStack_33c + fVar249 * fStack_34c);
            auVar64 = maxps(auVar64,auVar81);
            uVar46 = -(uint)(local_3a8 <= auVar64._0_4_);
            uVar47 = -(uint)(fStack_3a4 <= auVar64._4_4_);
            uVar48 = -(uint)(fStack_3a0 <= auVar64._8_4_);
            uVar49 = -(uint)(fStack_39c <= auVar64._12_4_);
            fVar193 = (float)((uint)fVar227 & uVar46 | ~uVar46 & local_2f8._0_4_);
            fVar196 = (float)((uint)fVar229 & uVar47 | ~uVar47 & local_2f8._4_4_);
            fVar198 = (float)((uint)fVar252 & uVar48 | ~uVar48 & (uint)fStack_2f0);
            fVar211 = (float)((uint)fVar253 & uVar49 | ~uVar49 & (uint)fStack_2ec);
            fVar205 = (float)(~uVar46 & (uint)fVar208 | (uint)fVar161 & uVar46);
            fVar208 = (float)(~uVar47 & (uint)fVar209 | (uint)fVar162 & uVar47);
            fVar172 = (float)(~uVar48 & (uint)fVar210 | (uint)fVar175 & uVar48);
            fVar173 = (float)(~uVar49 & (uint)fVar212 | (uint)fVar192 & uVar49);
            fVar141 = auVar223._0_4_;
            fVar86 = auVar223._4_4_;
            fVar89 = auVar223._8_4_;
            fVar90 = auVar223._12_4_;
            auVar137._0_4_ = fVar163 * fVar163 + fVar141 * fVar141;
            auVar137._4_4_ = fVar158 * fVar158 + fVar86 * fVar86;
            auVar137._8_4_ = fVar213 * fVar213 + fVar89 * fVar89;
            auVar137._12_4_ = fVar215 * fVar215 + fVar90 * fVar90;
            auVar64 = rsqrtps(auVar156,auVar137);
            fVar111 = auVar64._0_4_;
            fVar112 = auVar64._4_4_;
            fVar119 = auVar64._8_4_;
            fVar129 = auVar64._12_4_;
            auVar157._0_4_ = fVar111 * fVar111 * auVar137._0_4_ * 0.5 * fVar111;
            auVar157._4_4_ = fVar112 * fVar112 * auVar137._4_4_ * 0.5 * fVar112;
            auVar157._8_4_ = fVar119 * fVar119 * auVar137._8_4_ * 0.5 * fVar119;
            auVar157._12_4_ = fVar129 * fVar129 * auVar137._12_4_ * 0.5 * fVar129;
            fVar160 = fVar111 * 1.5 - auVar157._0_4_;
            fVar169 = fVar112 * 1.5 - auVar157._4_4_;
            fVar171 = fVar119 * 1.5 - auVar157._8_4_;
            fVar174 = fVar129 * 1.5 - auVar157._12_4_;
            auVar138._0_4_ = fVar205 * fVar205 + fVar193 * fVar193;
            auVar138._4_4_ = fVar208 * fVar208 + fVar196 * fVar196;
            auVar138._8_4_ = fVar172 * fVar172 + fVar198 * fVar198;
            auVar138._12_4_ = fVar173 * fVar173 + fVar211 * fVar211;
            auVar64 = rsqrtps(auVar157,auVar138);
            fVar111 = auVar64._0_4_;
            fVar112 = auVar64._4_4_;
            fVar119 = auVar64._8_4_;
            fVar129 = auVar64._12_4_;
            fVar142 = fVar111 * 1.5 - fVar111 * fVar111 * auVar138._0_4_ * 0.5 * fVar111;
            fVar112 = fVar112 * 1.5 - fVar112 * fVar112 * auVar138._4_4_ * 0.5 * fVar112;
            fVar144 = fVar119 * 1.5 - fVar119 * fVar119 * auVar138._8_4_ * 0.5 * fVar119;
            fVar129 = fVar129 * 1.5 - fVar129 * fVar129 * auVar138._12_4_ * 0.5 * fVar129;
            fVar206 = fVar163 * fVar160 * auVar244._0_4_;
            fVar209 = fVar158 * fVar169 * auVar244._4_4_;
            fVar53 = fVar213 * fVar171 * auVar244._8_4_;
            fVar161 = fVar215 * fVar174 * auVar244._12_4_;
            fVar119 = -fVar141 * fVar160 * auVar244._0_4_;
            fVar141 = -fVar86 * fVar169 * auVar244._4_4_;
            fVar163 = -fVar89 * fVar171 * auVar244._8_4_;
            fVar158 = -fVar90 * fVar174 * auVar244._12_4_;
            fVar191 = fVar160 * 0.0 * auVar244._0_4_;
            fVar194 = fVar169 * 0.0 * auVar244._4_4_;
            fVar199 = fVar171 * 0.0 * auVar244._8_4_;
            fVar204 = fVar174 * 0.0 * auVar244._12_4_;
            local_378 = fVar88 + fVar191;
            fStack_374 = fVar92 + fVar194;
            fStack_370 = fVar94 + fVar199;
            fStack_36c = fVar159 + fVar204;
            fVar175 = fVar205 * fVar142 * auVar235._0_4_;
            fVar192 = fVar208 * fVar112 * auVar235._4_4_;
            fVar195 = fVar172 * fVar144 * auVar235._8_4_;
            fVar197 = fVar173 * fVar129 * auVar235._12_4_;
            fVar241 = fVar214 + fVar175;
            fVar247 = fVar216 + fVar192;
            fVar248 = fVar224 + fVar195;
            fVar249 = fVar226 + fVar197;
            fVar86 = -fVar193 * fVar142 * auVar235._0_4_;
            fVar89 = -fVar196 * fVar112 * auVar235._4_4_;
            fVar90 = -fVar198 * fVar144 * auVar235._8_4_;
            fVar111 = -fVar211 * fVar129 * auVar235._12_4_;
            fVar193 = fVar228 + fVar86;
            fVar196 = fVar230 + fVar89;
            fVar198 = fVar238 + fVar90;
            fVar211 = fVar239 + fVar111;
            fVar160 = fVar142 * 0.0 * auVar235._0_4_;
            fVar169 = fVar112 * 0.0 * auVar235._4_4_;
            fVar171 = fVar144 * 0.0 * auVar235._8_4_;
            fVar174 = fVar129 * 0.0 * auVar235._12_4_;
            fVar205 = fVar240 - fVar206;
            fVar208 = fVar143 - fVar209;
            fVar172 = fVar164 - fVar53;
            fVar173 = fVar170 - fVar161;
            fVar213 = fVar87 + fVar160;
            fVar215 = fVar91 + fVar169;
            fVar54 = fVar93 + fVar171;
            fVar162 = fVar145 + fVar174;
            fVar112 = local_258 - fVar119;
            fVar129 = fStack_254 - fVar141;
            fVar142 = fStack_250 - fVar163;
            fVar144 = fStack_24c - fVar158;
            fVar88 = fVar88 - fVar191;
            fVar92 = fVar92 - fVar194;
            fVar94 = fVar94 - fVar199;
            fVar159 = fVar159 - fVar204;
            uVar46 = -(uint)(0.0 < (fVar112 * (fVar213 - fVar88) - fVar88 * (fVar193 - fVar112)) *
                                   0.0 + (fVar88 * (fVar241 - fVar205) -
                                         (fVar213 - fVar88) * fVar205) * 0.0 +
                                         ((fVar193 - fVar112) * fVar205 -
                                         (fVar241 - fVar205) * fVar112));
            uVar47 = -(uint)(0.0 < (fVar129 * (fVar215 - fVar92) - fVar92 * (fVar196 - fVar129)) *
                                   0.0 + (fVar92 * (fVar247 - fVar208) -
                                         (fVar215 - fVar92) * fVar208) * 0.0 +
                                         ((fVar196 - fVar129) * fVar208 -
                                         (fVar247 - fVar208) * fVar129));
            uVar48 = -(uint)(0.0 < (fVar142 * (fVar54 - fVar94) - fVar94 * (fVar198 - fVar142)) *
                                   0.0 + (fVar94 * (fVar248 - fVar172) - (fVar54 - fVar94) * fVar172
                                         ) * 0.0 + ((fVar198 - fVar142) * fVar172 -
                                                   (fVar248 - fVar172) * fVar142));
            uVar49 = -(uint)(0.0 < (fVar144 * (fVar162 - fVar159) - fVar159 * (fVar211 - fVar144)) *
                                   0.0 + (fVar159 * (fVar249 - fVar173) -
                                         (fVar162 - fVar159) * fVar173) * 0.0 +
                                         ((fVar211 - fVar144) * fVar173 -
                                         (fVar249 - fVar173) * fVar144));
            fVar240 = (float)((uint)(fVar214 - fVar175) & uVar46 |
                             ~uVar46 & (uint)(fVar240 + fVar206));
            fVar143 = (float)((uint)(fVar216 - fVar192) & uVar47 |
                             ~uVar47 & (uint)(fVar143 + fVar209));
            fVar224 = (float)((uint)(fVar224 - fVar195) & uVar48 |
                             ~uVar48 & (uint)(fVar164 + fVar53));
            fVar226 = (float)((uint)(fVar226 - fVar197) & uVar49 |
                             ~uVar49 & (uint)(fVar170 + fVar161));
            fVar53 = (float)((uint)(fVar228 - fVar86) & uVar46 |
                            ~uVar46 & (uint)(local_258 + fVar119));
            fVar161 = (float)((uint)(fVar230 - fVar89) & uVar47 |
                             ~uVar47 & (uint)(fStack_254 + fVar141));
            fVar175 = (float)((uint)(fVar238 - fVar90) & uVar48 |
                             ~uVar48 & (uint)(fStack_250 + fVar163));
            fVar192 = (float)((uint)(fVar239 - fVar111) & uVar49 |
                             ~uVar49 & (uint)(fStack_24c + fVar158));
            fVar191 = (float)((uint)(fVar87 - fVar160) & uVar46 | ~uVar46 & (uint)local_378);
            fVar194 = (float)((uint)(fVar91 - fVar169) & uVar47 | ~uVar47 & (uint)fStack_374);
            fVar199 = (float)((uint)(fVar93 - fVar171) & uVar48 | ~uVar48 & (uint)fStack_370);
            fVar204 = (float)((uint)(fVar145 - fVar174) & uVar49 | ~uVar49 & (uint)fStack_36c);
            fVar206 = (float)((uint)fVar205 & uVar46 | ~uVar46 & (uint)fVar241);
            fVar209 = (float)((uint)fVar208 & uVar47 | ~uVar47 & (uint)fVar247);
            fVar214 = (float)((uint)fVar172 & uVar48 | ~uVar48 & (uint)fVar248);
            fVar216 = (float)((uint)fVar173 & uVar49 | ~uVar49 & (uint)fVar249);
            fVar119 = (float)((uint)fVar112 & uVar46 | ~uVar46 & (uint)fVar193);
            fVar141 = (float)((uint)fVar129 & uVar47 | ~uVar47 & (uint)fVar196);
            fVar163 = (float)((uint)fVar142 & uVar48 | ~uVar48 & (uint)fVar198);
            fVar158 = (float)((uint)fVar144 & uVar49 | ~uVar49 & (uint)fVar211);
            fVar160 = (float)((uint)fVar88 & uVar46 | ~uVar46 & (uint)fVar213);
            fVar169 = (float)((uint)fVar92 & uVar47 | ~uVar47 & (uint)fVar215);
            fVar171 = (float)((uint)fVar94 & uVar48 | ~uVar48 & (uint)fVar54);
            fVar174 = (float)((uint)fVar159 & uVar49 | ~uVar49 & (uint)fVar162);
            fVar205 = (float)((uint)fVar241 & uVar46 | ~uVar46 & (uint)fVar205) - fVar240;
            fVar208 = (float)((uint)fVar247 & uVar47 | ~uVar47 & (uint)fVar208) - fVar143;
            fVar228 = (float)((uint)fVar248 & uVar48 | ~uVar48 & (uint)fVar172) - fVar224;
            fVar230 = (float)((uint)fVar249 & uVar49 | ~uVar49 & (uint)fVar173) - fVar226;
            fVar238 = (float)((uint)fVar193 & uVar46 | ~uVar46 & (uint)fVar112) - fVar53;
            fVar239 = (float)((uint)fVar196 & uVar47 | ~uVar47 & (uint)fVar129) - fVar161;
            fVar164 = (float)((uint)fVar198 & uVar48 | ~uVar48 & (uint)fVar142) - fVar175;
            fVar170 = (float)((uint)fVar211 & uVar49 | ~uVar49 & (uint)fVar144) - fVar192;
            fVar172 = (float)((uint)fVar213 & uVar46 | ~uVar46 & (uint)fVar88) - fVar191;
            fVar173 = (float)((uint)fVar215 & uVar47 | ~uVar47 & (uint)fVar92) - fVar194;
            fVar241 = (float)((uint)fVar54 & uVar48 | ~uVar48 & (uint)fVar94) - fVar199;
            fVar247 = (float)((uint)fVar162 & uVar49 | ~uVar49 & (uint)fVar159) - fVar204;
            fVar198 = fVar240 - fVar206;
            fVar211 = fVar143 - fVar209;
            fVar213 = fVar224 - fVar214;
            fVar215 = fVar226 - fVar216;
            fVar86 = fVar53 - fVar119;
            fVar89 = fVar161 - fVar141;
            fVar90 = fVar175 - fVar163;
            fVar111 = fVar192 - fVar158;
            fVar112 = fVar191 - fVar160;
            fVar129 = fVar194 - fVar169;
            fVar142 = fVar199 - fVar171;
            fVar144 = fVar204 - fVar174;
            fVar248 = (fVar53 * fVar172 - fVar191 * fVar238) * 0.0 +
                      (fVar191 * fVar205 - fVar240 * fVar172) * 0.0 +
                      (fVar240 * fVar238 - fVar53 * fVar205);
            fVar249 = (fVar161 * fVar173 - fVar194 * fVar239) * 0.0 +
                      (fVar194 * fVar208 - fVar143 * fVar173) * 0.0 +
                      (fVar143 * fVar239 - fVar161 * fVar208);
            auVar125._4_4_ = fVar249;
            auVar125._0_4_ = fVar248;
            fVar193 = (fVar175 * fVar241 - fVar199 * fVar164) * 0.0 +
                      (fVar199 * fVar228 - fVar224 * fVar241) * 0.0 +
                      (fVar224 * fVar164 - fVar175 * fVar228);
            fVar196 = (fVar192 * fVar247 - fVar204 * fVar170) * 0.0 +
                      (fVar204 * fVar230 - fVar226 * fVar247) * 0.0 +
                      (fVar226 * fVar170 - fVar192 * fVar230);
            auVar251._0_4_ =
                 (fVar119 * fVar112 - fVar160 * fVar86) * 0.0 +
                 (fVar160 * fVar198 - fVar206 * fVar112) * 0.0 +
                 (fVar206 * fVar86 - fVar119 * fVar198);
            auVar251._4_4_ =
                 (fVar141 * fVar129 - fVar169 * fVar89) * 0.0 +
                 (fVar169 * fVar211 - fVar209 * fVar129) * 0.0 +
                 (fVar209 * fVar89 - fVar141 * fVar211);
            auVar251._8_4_ =
                 (fVar163 * fVar142 - fVar171 * fVar90) * 0.0 +
                 (fVar171 * fVar213 - fVar214 * fVar142) * 0.0 +
                 (fVar214 * fVar90 - fVar163 * fVar213);
            auVar251._12_4_ =
                 (fVar158 * fVar144 - fVar174 * fVar111) * 0.0 +
                 (fVar174 * fVar215 - fVar216 * fVar144) * 0.0 +
                 (fVar216 * fVar111 - fVar158 * fVar215);
            auVar125._8_4_ = fVar193;
            auVar125._12_4_ = fVar196;
            auVar64 = maxps(auVar125,auVar251);
            bVar31 = auVar64._0_4_ <= 0.0 && bVar31;
            auVar126._0_4_ = -(uint)bVar31;
            bVar30 = auVar64._4_4_ <= 0.0 && bVar30;
            auVar126._4_4_ = -(uint)bVar30;
            bVar32 = auVar64._8_4_ <= 0.0 && bVar32;
            auVar126._8_4_ = -(uint)bVar32;
            bVar33 = auVar64._12_4_ <= 0.0 && bVar33;
            auVar126._12_4_ = -(uint)bVar33;
            iVar34 = movmskps((int)puVar38,auVar126);
            if (iVar34 == 0) {
LAB_00a8c889:
              auVar118._8_8_ = uStack_3b0;
              auVar118._0_8_ = local_3b8;
            }
            else {
              fVar163 = fVar86 * fVar172 - fVar112 * fVar238;
              fVar158 = fVar89 * fVar173 - fVar129 * fVar239;
              fVar160 = fVar90 * fVar241 - fVar142 * fVar164;
              fVar169 = fVar111 * fVar247 - fVar144 * fVar170;
              fVar119 = fVar112 * fVar205 - fVar172 * fVar198;
              fVar129 = fVar129 * fVar208 - fVar173 * fVar211;
              fVar141 = fVar142 * fVar228 - fVar241 * fVar213;
              fVar142 = fVar144 * fVar230 - fVar247 * fVar215;
              fVar86 = fVar198 * fVar238 - fVar86 * fVar205;
              fVar144 = fVar211 * fVar239 - fVar89 * fVar208;
              fVar171 = fVar213 * fVar164 - fVar90 * fVar228;
              fVar174 = fVar215 * fVar170 - fVar111 * fVar230;
              auVar117._0_4_ = fVar119 * 0.0 + fVar86;
              auVar117._4_4_ = fVar129 * 0.0 + fVar144;
              auVar117._8_4_ = fVar141 * 0.0 + fVar171;
              auVar117._12_4_ = fVar142 * 0.0 + fVar174;
              auVar168._0_4_ = fVar163 * 0.0 + auVar117._0_4_;
              auVar168._4_4_ = fVar158 * 0.0 + auVar117._4_4_;
              auVar168._8_4_ = fVar160 * 0.0 + auVar117._8_4_;
              auVar168._12_4_ = fVar169 * 0.0 + auVar117._12_4_;
              auVar64 = rcpps(auVar117,auVar168);
              fVar89 = auVar64._0_4_;
              fVar90 = auVar64._4_4_;
              fVar111 = auVar64._8_4_;
              fVar112 = auVar64._12_4_;
              fVar89 = (1.0 - auVar168._0_4_ * fVar89) * fVar89 + fVar89;
              fVar90 = (1.0 - auVar168._4_4_ * fVar90) * fVar90 + fVar90;
              fVar111 = (1.0 - auVar168._8_4_ * fVar111) * fVar111 + fVar111;
              fVar112 = (1.0 - auVar168._12_4_ * fVar112) * fVar112 + fVar112;
              fVar119 = (fVar191 * fVar86 + fVar53 * fVar119 + fVar240 * fVar163) * fVar89;
              fVar129 = (fVar194 * fVar144 + fVar161 * fVar129 + fVar143 * fVar158) * fVar90;
              auVar237._4_4_ = fVar129;
              auVar237._0_4_ = fVar119;
              fVar141 = (fVar199 * fVar171 + fVar175 * fVar141 + fVar224 * fVar160) * fVar111;
              fVar142 = (fVar204 * fVar174 + fVar192 * fVar142 + fVar226 * fVar169) * fVar112;
              fVar86 = *(float *)(ray + k * 4 + 0x80);
              bVar31 = ((float)local_2a8._0_4_ <= fVar119 && fVar119 <= fVar86) && bVar31;
              auVar139._0_4_ = -(uint)bVar31;
              bVar30 = ((float)local_2a8._4_4_ <= fVar129 && fVar129 <= fVar86) && bVar30;
              auVar139._4_4_ = -(uint)bVar30;
              bVar32 = (fStack_2a0 <= fVar141 && fVar141 <= fVar86) && bVar32;
              auVar139._8_4_ = -(uint)bVar32;
              bVar33 = (fStack_29c <= fVar142 && fVar142 <= fVar86) && bVar33;
              auVar139._12_4_ = -(uint)bVar33;
              iVar34 = movmskps(iVar34,auVar139);
              if (iVar34 == 0) goto LAB_00a8c889;
              auVar140._0_8_ =
                   CONCAT44(-(uint)(auVar168._4_4_ != 0.0 && bVar30),
                            -(uint)(auVar168._0_4_ != 0.0 && bVar31));
              auVar140._8_4_ = -(uint)(auVar168._8_4_ != 0.0 && bVar32);
              auVar140._12_4_ = -(uint)(auVar168._12_4_ != 0.0 && bVar33);
              iVar34 = movmskps(iVar34,auVar140);
              auVar118._8_8_ = uStack_3b0;
              auVar118._0_8_ = local_3b8;
              if (iVar34 != 0) {
                fVar248 = fVar248 * fVar89;
                fVar249 = fVar249 * fVar90;
                fVar193 = fVar193 * fVar111;
                fVar196 = fVar196 * fVar112;
                local_4d8 = (float)((uint)(1.0 - fVar248) & uVar46 | ~uVar46 & (uint)fVar248);
                fStack_4d4 = (float)((uint)(1.0 - fVar249) & uVar47 | ~uVar47 & (uint)fVar249);
                fStack_4d0 = (float)((uint)(1.0 - fVar193) & uVar48 | ~uVar48 & (uint)fVar193);
                fStack_4cc = (float)((uint)(1.0 - fVar196) & uVar49 | ~uVar49 & (uint)fVar196);
                local_288 = (float)(~uVar46 & (uint)(auVar251._0_4_ * fVar89) |
                                   (uint)(1.0 - auVar251._0_4_ * fVar89) & uVar46);
                fStack_284 = (float)(~uVar47 & (uint)(auVar251._4_4_ * fVar90) |
                                    (uint)(1.0 - auVar251._4_4_ * fVar90) & uVar47);
                fStack_280 = (float)(~uVar48 & (uint)(auVar251._8_4_ * fVar111) |
                                    (uint)(1.0 - auVar251._8_4_ * fVar111) & uVar48);
                fStack_27c = (float)(~uVar49 & (uint)(auVar251._12_4_ * fVar112) |
                                    (uint)(1.0 - auVar251._12_4_ * fVar112) & uVar49);
                auVar118._8_4_ = auVar140._8_4_;
                auVar118._0_8_ = auVar140._0_8_;
                auVar118._12_4_ = auVar140._12_4_;
                auVar237._8_4_ = fVar141;
                auVar237._12_4_ = fVar142;
                auVar231 = auVar237;
              }
            }
            uVar46 = movmskps(iVar34,auVar118);
            puVar38 = (undefined1 *)(ulong)uVar46;
            fStack_2e0 = fVar210;
            fStack_2dc = fVar212;
            if (uVar46 != 0) {
              fVar89 = (auVar235._0_4_ - auVar244._0_4_) * local_4d8 + auVar244._0_4_;
              fVar90 = (auVar235._4_4_ - auVar244._4_4_) * fStack_4d4 + auVar244._4_4_;
              fVar111 = (auVar235._8_4_ - auVar244._8_4_) * fStack_4d0 + auVar244._8_4_;
              fVar112 = (auVar235._12_4_ - auVar244._12_4_) * fStack_4cc + auVar244._12_4_;
              fVar86 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
              local_158._0_4_ =
                   -(uint)(fVar86 * (fVar89 + fVar89) < auVar231._0_4_) & auVar118._0_4_;
              local_158._4_4_ =
                   -(uint)(fVar86 * (fVar90 + fVar90) < auVar231._4_4_) & auVar118._4_4_;
              local_158._8_4_ =
                   -(uint)(fVar86 * (fVar111 + fVar111) < auVar231._8_4_) & auVar118._8_4_;
              local_158._12_4_ =
                   -(uint)(fVar86 * (fVar112 + fVar112) < auVar231._12_4_) & auVar118._12_4_;
              uVar46 = movmskps(uVar46,local_158);
              puVar38 = (undefined1 *)(ulong)uVar46;
              if (uVar46 != 0) {
                local_288 = local_288 + local_288 + -1.0;
                fStack_284 = fStack_284 + fStack_284 + -1.0;
                fStack_280 = fStack_280 + fStack_280 + -1.0;
                fStack_27c = fStack_27c + fStack_27c + -1.0;
                local_1d8._4_4_ = fStack_4d4;
                local_1d8._0_4_ = local_4d8;
                fStack_1d0 = fStack_4d0;
                fStack_1cc = fStack_4cc;
                local_198 = CONCAT44(fStack_2b4,local_2b8);
                uStack_190 = CONCAT44(fStack_2ac,fStack_2b0);
                local_178 = CONCAT44(fStack_2c4,local_2c8);
                uStack_170 = CONCAT44(fStack_2bc,fStack_2c0);
                local_168 = CONCAT44(fStack_2d4,local_2d8);
                uStack_160 = CONCAT44(fStack_2cc,fStack_2d0);
                pGVar41 = (context->scene->geometries).items[local_3c0].ptr;
                if ((pGVar41->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  bVar39 = 0;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar39 = 1, pGVar41->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  fVar86 = (float)(int)local_1a8;
                  local_148[0] = (fVar86 + local_4d8 + 0.0) * local_88;
                  local_148[1] = (fVar86 + fStack_4d4 + 1.0) * fStack_84;
                  local_148[2] = (fVar86 + fStack_4d0 + 2.0) * fStack_80;
                  local_148[3] = (fVar86 + fStack_4cc + 3.0) * fStack_7c;
                  local_138 = CONCAT44(fStack_284,local_288);
                  uStack_130 = CONCAT44(fStack_27c,fStack_280);
                  local_128 = auVar231;
                  puVar38 = (undefined1 *)(ulong)(byte)uVar46;
                  lVar11 = 0;
                  if (puVar38 != (undefined1 *)0x0) {
                    for (; ((byte)uVar46 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
                    }
                  }
                  local_4e8 = (uint)lVar11;
                  uStack_4e4 = (undefined4)((ulong)lVar11 >> 0x20);
                  auVar64 = *local_330;
                  uVar6 = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_338 = context;
                  _local_268 = *pauVar4;
                  local_1c8 = local_288;
                  fStack_1c4 = fStack_284;
                  fStack_1c0 = fStack_280;
                  fStack_1bc = fStack_27c;
                  local_1b8 = auVar231;
                  local_1a4 = iVar7;
                  local_188 = fVar120;
                  fStack_184 = fVar51;
                  fStack_180 = fVar52;
                  fStack_17c = fVar85;
                  do {
                    lVar11 = CONCAT44(uStack_4e4,local_4e8);
                    local_e8 = local_148[lVar11];
                    local_d8 = *(undefined4 *)((long)&local_138 + lVar11 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_128 + lVar11 * 4);
                    fVar112 = 1.0 - local_e8;
                    fVar86 = local_e8 * 3.0;
                    fVar111 = ((fVar86 + 2.0) * (fVar112 + fVar112) + fVar112 * -3.0 * fVar112) *
                              0.5;
                    fVar89 = (local_e8 * local_e8 + fVar112 * -2.0 * local_e8) * 0.5;
                    fVar90 = (local_e8 * fVar86 + (fVar86 + -5.0) * (local_e8 + local_e8)) * 0.5;
                    local_328.context = context->user;
                    fVar86 = (local_e8 * (fVar112 + fVar112) - fVar112 * fVar112) * 0.5;
                    local_118 = fVar86 * local_2b8 +
                                fVar90 * fVar120 + fVar111 * local_2c8 + fVar89 * local_2d8;
                    local_108 = fVar86 * fStack_2b4 +
                                fVar90 * fVar51 + fVar111 * fStack_2c4 + fVar89 * fStack_2d4;
                    local_f8 = fVar86 * fStack_2b0 +
                               fVar90 * fVar52 + fVar111 * fStack_2c0 + fVar89 * fStack_2d0;
                    fStack_114 = local_118;
                    fStack_110 = local_118;
                    fStack_10c = local_118;
                    fStack_104 = local_108;
                    fStack_100 = local_108;
                    fStack_fc = local_108;
                    fStack_f4 = local_f8;
                    fStack_f0 = local_f8;
                    fStack_ec = local_f8;
                    fStack_e4 = local_e8;
                    fStack_e0 = local_e8;
                    fStack_dc = local_e8;
                    uStack_d4 = local_d8;
                    uStack_d0 = local_d8;
                    uStack_cc = local_d8;
                    local_c8 = CONCAT44(uStack_74,local_78);
                    uStack_c0 = CONCAT44(uStack_6c,uStack_70);
                    local_b8 = CONCAT44(uStack_64,local_68);
                    uStack_b0 = CONCAT44(uStack_5c,uStack_60);
                    local_a8 = (local_328.context)->instID[0];
                    uStack_a4 = local_a8;
                    uStack_a0 = local_a8;
                    uStack_9c = local_a8;
                    local_98 = (local_328.context)->instPrimID[0];
                    uStack_94 = local_98;
                    uStack_90 = local_98;
                    uStack_8c = local_98;
                    local_328.valid = (int *)local_3d8;
                    local_328.geometryUserPtr = pGVar41->userPtr;
                    local_328.hit = (RTCHitN *)&local_118;
                    local_328.N = 4;
                    p_Var36 = pGVar41->occlusionFilterN;
                    local_3d8 = auVar64;
                    local_328.ray = (RTCRayN *)ray;
                    if (p_Var36 != (RTCFilterFunctionN)0x0) {
                      p_Var36 = (RTCFilterFunctionN)(*p_Var36)(&local_328);
                      context = local_338;
                    }
                    auVar108._0_4_ = -(uint)(local_3d8._0_4_ == 0);
                    auVar108._4_4_ = -(uint)(local_3d8._4_4_ == 0);
                    auVar108._8_4_ = -(uint)(local_3d8._8_4_ == 0);
                    auVar108._12_4_ = -(uint)(local_3d8._12_4_ == 0);
                    uVar46 = movmskps((int)p_Var36,auVar108);
                    pRVar37 = (RTCRayN *)(ulong)(uVar46 ^ 0xf);
                    if ((uVar46 ^ 0xf) == 0) {
                      auVar108 = auVar108 ^ _DAT_01f7ae20;
                    }
                    else {
                      p_Var36 = context->args->filter;
                      if ((p_Var36 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar41->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var36)(&local_328);
                        context = local_338;
                      }
                      auVar82._0_4_ = -(uint)(local_3d8._0_4_ == 0);
                      auVar82._4_4_ = -(uint)(local_3d8._4_4_ == 0);
                      auVar82._8_4_ = -(uint)(local_3d8._8_4_ == 0);
                      auVar82._12_4_ = -(uint)(local_3d8._12_4_ == 0);
                      auVar108 = auVar82 ^ _DAT_01f7ae20;
                      *(undefined1 (*) [16])(local_328.ray + 0x80) =
                           ~auVar82 & _DAT_01f7aa00 |
                           *(undefined1 (*) [16])(local_328.ray + 0x80) & auVar82;
                      pRVar37 = local_328.ray;
                    }
                    auVar109._0_4_ = auVar108._0_4_ << 0x1f;
                    auVar109._4_4_ = auVar108._4_4_ << 0x1f;
                    auVar109._8_4_ = auVar108._8_4_ << 0x1f;
                    auVar109._12_4_ = auVar108._12_4_ << 0x1f;
                    iVar34 = movmskps((int)pRVar37,auVar109);
                    if (iVar34 != 0) {
                      bVar39 = 1;
                      break;
                    }
                    *(undefined4 *)(ray + k * 4 + 0x80) = uVar6;
                    puVar38 = (undefined1 *)((ulong)puVar38 ^ 1L << ((ulong)local_4e8 & 0x3f));
                    lVar11 = 0;
                    if (puVar38 != (undefined1 *)0x0) {
                      for (; ((ulong)puVar38 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
                      }
                    }
                    local_4e8 = (uint)lVar11;
                    uStack_4e4 = (undefined4)((ulong)lVar11 >> 0x20);
                    bVar39 = 0;
                  } while (puVar38 != (undefined1 *)0x0);
                }
                bVar42 = (bool)(bVar42 | bVar39);
              }
            }
          }
          local_4e8 = (uint)puVar38;
          lVar44 = lVar44 + 4;
        } while ((int)lVar44 < iVar7);
      }
      if (bVar42) {
        return bVar42;
      }
      fVar120 = *(float *)(ray + k * 4 + 0x80);
      auVar107._4_4_ = -(uint)(fStack_44 <= fVar120);
      auVar107._0_4_ = -(uint)(local_48 <= fVar120);
      auVar107._8_4_ = -(uint)(fStack_40 <= fVar120);
      auVar107._12_4_ = -(uint)(fStack_3c <= fVar120);
      uVar46 = movmskps(local_4e8,auVar107);
      uVar46 = (uint)uVar45 & uVar46;
    } while (uVar46 != 0);
  }
  return bVar42;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }